

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCRayQueryContext *pRVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  ulong uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  ulong uVar85;
  ulong uVar86;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar87;
  uint uVar88;
  byte bVar89;
  uint uVar90;
  long lVar91;
  long lVar92;
  ulong uVar93;
  bool bVar94;
  vint4 ai;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar102 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  float fVar144;
  float fVar145;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar148;
  float fVar150;
  float fVar151;
  undefined1 auVar131 [32];
  float fVar146;
  undefined1 auVar132 [32];
  float fVar147;
  float fVar149;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar152;
  float fVar178;
  float fVar180;
  vint4 bi_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar153;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar170 [32];
  float fVar179;
  float fVar182;
  float fVar185;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  vint4 bi;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar223;
  float fVar225;
  vint4 bi_1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar227;
  undefined1 auVar216 [32];
  float fVar224;
  float fVar226;
  float fVar228;
  float fVar230;
  float fVar232;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar229;
  float fVar231;
  float fVar233;
  undefined1 auVar222 [64];
  float fVar234;
  float fVar251;
  float fVar252;
  vint4 ai_1;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [28];
  float fVar254;
  float fVar255;
  undefined1 auVar243 [32];
  float fVar253;
  float fVar256;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar257;
  float fVar265;
  float fVar266;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar262 [28];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar271;
  float fVar272;
  float fVar280;
  float fVar281;
  vint4 ai_2;
  undefined1 auVar273 [16];
  float fVar283;
  undefined1 auVar274 [16];
  undefined1 auVar275 [28];
  float fVar282;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [64];
  float s;
  float fVar299;
  float fVar300;
  float fVar309;
  float fVar310;
  float fVar312;
  float fVar313;
  float fVar315;
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar321;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar308;
  float fVar311;
  undefined1 auVar301 [16];
  float fVar298;
  float fVar314;
  undefined1 auVar302 [16];
  float fVar317;
  float fVar319;
  float fVar322;
  undefined1 auVar307 [64];
  float fVar326;
  float fVar327;
  float fVar331;
  float fVar333;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar332;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar330 [16];
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar350;
  float fVar351;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar353;
  float fVar357;
  undefined1 auVar347 [32];
  float fVar352;
  undefined1 auVar348 [32];
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar349 [64];
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar365;
  float fVar368;
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar366;
  float fVar367;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar384;
  float fVar388;
  float fVar389;
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar387 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  float fVar396;
  float fVar399;
  float fVar400;
  undefined1 auVar397 [16];
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  undefined1 auVar398 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d24;
  float local_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float local_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined1 local_be0 [8];
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [32];
  undefined1 (*local_ab0) [16];
  undefined1 (*local_aa8) [16];
  undefined1 (*local_aa0) [32];
  ulong local_a98;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 auStack_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  Primitive *local_950;
  ulong local_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  RTCHitN local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint uStack_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint local_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  uint uStack_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar8 = prim[1];
  uVar85 = (ulong)(byte)PVar8;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xf + 6)));
  lVar91 = uVar85 * 0x25;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x11 + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1a + 6)));
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1b + 6)));
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1c + 6)));
  auVar120 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar120 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar120 = vsubps_avx(auVar120,*(undefined1 (*) [16])(prim + lVar91 + 6));
  fVar271 = *(float *)(prim + lVar91 + 0x12);
  auVar207._0_4_ = fVar271 * auVar120._0_4_;
  auVar207._4_4_ = fVar271 * auVar120._4_4_;
  auVar207._8_4_ = fVar271 * auVar120._8_4_;
  auVar207._12_4_ = fVar271 * auVar120._12_4_;
  auVar328._0_4_ = fVar271 * auVar16._0_4_;
  auVar328._4_4_ = fVar271 * auVar16._4_4_;
  auVar328._8_4_ = fVar271 * auVar16._8_4_;
  auVar328._12_4_ = fVar271 * auVar16._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar19);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar120 = vshufps_avx(auVar328,auVar328,0x55);
  auVar16 = vshufps_avx(auVar328,auVar328,0xaa);
  fVar333 = auVar16._0_4_;
  fVar283 = auVar16._4_4_;
  fVar314 = auVar16._8_4_;
  fVar335 = auVar16._12_4_;
  fVar308 = auVar120._0_4_;
  fVar331 = auVar120._4_4_;
  fVar281 = auVar120._8_4_;
  fVar311 = auVar120._12_4_;
  auVar211 = vcvtdq2ps_avx(auVar18);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar120 = vshufps_avx(auVar328,auVar328,0);
  fVar271 = auVar120._0_4_;
  fVar298 = auVar120._4_4_;
  fVar326 = auVar120._8_4_;
  fVar280 = auVar120._12_4_;
  auVar301._0_4_ = fVar271 * auVar211._0_4_ + fVar308 * auVar15._0_4_ + fVar333 * auVar20._0_4_;
  auVar301._4_4_ = fVar298 * auVar211._4_4_ + fVar331 * auVar15._4_4_ + fVar283 * auVar20._4_4_;
  auVar301._8_4_ = fVar326 * auVar211._8_4_ + fVar281 * auVar15._8_4_ + fVar314 * auVar20._8_4_;
  auVar301._12_4_ = fVar280 * auVar211._12_4_ + fVar311 * auVar15._12_4_ + fVar335 * auVar20._12_4_;
  auVar273._0_4_ = fVar271 * auVar161._0_4_ + fVar308 * auVar21._0_4_ + fVar333 * auVar167._0_4_;
  auVar273._4_4_ = fVar298 * auVar161._4_4_ + fVar331 * auVar21._4_4_ + fVar283 * auVar167._4_4_;
  auVar273._8_4_ = fVar326 * auVar161._8_4_ + fVar281 * auVar21._8_4_ + fVar314 * auVar167._8_4_;
  auVar273._12_4_ = fVar280 * auVar161._12_4_ + fVar311 * auVar21._12_4_ + fVar335 * auVar167._12_4_
  ;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar120);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar329._0_4_ = fVar308 * auVar100._0_4_ + fVar333 * auVar121._0_4_ + fVar271 * auVar95._0_4_;
  auVar329._4_4_ = fVar331 * auVar100._4_4_ + fVar283 * auVar121._4_4_ + fVar298 * auVar95._4_4_;
  auVar329._8_4_ = fVar281 * auVar100._8_4_ + fVar314 * auVar121._8_4_ + fVar326 * auVar95._8_4_;
  auVar329._12_4_ = fVar311 * auVar100._12_4_ + fVar335 * auVar121._12_4_ + fVar280 * auVar95._12_4_
  ;
  auVar120 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar271 = auVar120._0_4_;
  fVar280 = auVar120._4_4_;
  fVar281 = auVar120._8_4_;
  fVar283 = auVar120._12_4_;
  auVar120 = vshufps_avx(auVar207,auVar207,0x55);
  fVar298 = auVar120._0_4_;
  fVar308 = auVar120._4_4_;
  fVar311 = auVar120._8_4_;
  fVar314 = auVar120._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar97 = vpmovsxwd_avx(auVar16);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar156 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar85 * 0xd + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar120 = vshufps_avx(auVar207,auVar207,0);
  fVar326 = auVar120._0_4_;
  fVar331 = auVar120._4_4_;
  fVar333 = auVar120._8_4_;
  fVar335 = auVar120._12_4_;
  auVar293._0_4_ = auVar15._0_4_ * fVar298 + auVar20._0_4_ * fVar271 + auVar211._0_4_ * fVar326;
  auVar293._4_4_ = auVar15._4_4_ * fVar308 + auVar20._4_4_ * fVar280 + auVar211._4_4_ * fVar331;
  auVar293._8_4_ = auVar15._8_4_ * fVar311 + auVar20._8_4_ * fVar281 + auVar211._8_4_ * fVar333;
  auVar293._12_4_ = auVar15._12_4_ * fVar314 + auVar20._12_4_ * fVar283 + auVar211._12_4_ * fVar335;
  auVar208._0_4_ = auVar167._0_4_ * fVar271 + fVar298 * auVar21._0_4_ + fVar326 * auVar161._0_4_;
  auVar208._4_4_ = auVar167._4_4_ * fVar280 + fVar308 * auVar21._4_4_ + fVar331 * auVar161._4_4_;
  auVar208._8_4_ = auVar167._8_4_ * fVar281 + fVar311 * auVar21._8_4_ + fVar333 * auVar161._8_4_;
  auVar208._12_4_ = auVar167._12_4_ * fVar283 + fVar314 * auVar21._12_4_ + fVar335 * auVar161._12_4_
  ;
  auVar385._8_4_ = 0x7fffffff;
  auVar385._0_8_ = 0x7fffffff7fffffff;
  auVar385._12_4_ = 0x7fffffff;
  auVar120 = vandps_avx(auVar301,auVar385);
  auVar343._8_4_ = 0x219392ef;
  auVar343._0_8_ = 0x219392ef219392ef;
  auVar343._12_4_ = 0x219392ef;
  auVar120 = vcmpps_avx(auVar120,auVar343,1);
  auVar16 = vblendvps_avx(auVar301,auVar343,auVar120);
  auVar120 = vandps_avx(auVar385,auVar273);
  auVar120 = vcmpps_avx(auVar120,auVar343,1);
  auVar18 = vblendvps_avx(auVar273,auVar343,auVar120);
  auVar120 = vandps_avx(auVar329,auVar385);
  auVar120 = vcmpps_avx(auVar120,auVar343,1);
  auVar120 = vblendvps_avx(auVar329,auVar343,auVar120);
  auVar258._0_4_ = auVar95._0_4_ * fVar326 + fVar298 * auVar100._0_4_ + fVar271 * auVar121._0_4_;
  auVar258._4_4_ = auVar95._4_4_ * fVar331 + fVar308 * auVar100._4_4_ + fVar280 * auVar121._4_4_;
  auVar258._8_4_ = auVar95._8_4_ * fVar333 + fVar311 * auVar100._8_4_ + fVar281 * auVar121._8_4_;
  auVar258._12_4_ = auVar95._12_4_ * fVar335 + fVar314 * auVar100._12_4_ + fVar283 * auVar121._12_4_
  ;
  auVar15 = vrcpps_avx(auVar16);
  fVar271 = auVar15._0_4_;
  auVar102._0_4_ = auVar16._0_4_ * fVar271;
  fVar280 = auVar15._4_4_;
  auVar102._4_4_ = auVar16._4_4_ * fVar280;
  fVar281 = auVar15._8_4_;
  auVar102._8_4_ = auVar16._8_4_ * fVar281;
  fVar283 = auVar15._12_4_;
  auVar102._12_4_ = auVar16._12_4_ * fVar283;
  auVar344._8_4_ = 0x3f800000;
  auVar344._0_8_ = 0x3f8000003f800000;
  auVar344._12_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar344,auVar102);
  fVar271 = fVar271 + fVar271 * auVar16._0_4_;
  fVar280 = fVar280 + fVar280 * auVar16._4_4_;
  fVar281 = fVar281 + fVar281 * auVar16._8_4_;
  fVar283 = fVar283 + fVar283 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar18);
  fVar298 = auVar16._0_4_;
  auVar154._0_4_ = auVar18._0_4_ * fVar298;
  fVar308 = auVar16._4_4_;
  auVar154._4_4_ = auVar18._4_4_ * fVar308;
  fVar311 = auVar16._8_4_;
  auVar154._8_4_ = auVar18._8_4_ * fVar311;
  fVar314 = auVar16._12_4_;
  auVar154._12_4_ = auVar18._12_4_ * fVar314;
  auVar16 = vsubps_avx(auVar344,auVar154);
  fVar298 = fVar298 + fVar298 * auVar16._0_4_;
  fVar308 = fVar308 + fVar308 * auVar16._4_4_;
  fVar311 = fVar311 + fVar311 * auVar16._8_4_;
  fVar314 = fVar314 + fVar314 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar120);
  fVar326 = auVar16._0_4_;
  auVar155._0_4_ = auVar120._0_4_ * fVar326;
  fVar331 = auVar16._4_4_;
  auVar155._4_4_ = auVar120._4_4_ * fVar331;
  fVar333 = auVar16._8_4_;
  auVar155._8_4_ = auVar120._8_4_ * fVar333;
  fVar335 = auVar16._12_4_;
  auVar155._12_4_ = auVar120._12_4_ * fVar335;
  auVar120 = vsubps_avx(auVar344,auVar155);
  fVar326 = fVar326 + fVar326 * auVar120._0_4_;
  fVar331 = fVar331 + fVar331 * auVar120._4_4_;
  fVar333 = fVar333 + fVar333 * auVar120._8_4_;
  fVar335 = fVar335 + fVar335 * auVar120._12_4_;
  auVar18 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                         *(float *)(prim + lVar91 + 0x16)) *
                                        *(float *)(prim + lVar91 + 0x1a))),0);
  auVar120 = vcvtdq2ps_avx(auVar96);
  auVar16 = vcvtdq2ps_avx(auVar97);
  auVar16 = vsubps_avx(auVar16,auVar120);
  fVar152 = auVar18._0_4_;
  fVar206 = auVar18._4_4_;
  fVar223 = auVar18._8_4_;
  fVar225 = auVar18._12_4_;
  auVar95._0_4_ = fVar152 * auVar16._0_4_ + auVar120._0_4_;
  auVar95._4_4_ = fVar206 * auVar16._4_4_ + auVar120._4_4_;
  auVar95._8_4_ = fVar223 * auVar16._8_4_ + auVar120._8_4_;
  auVar95._12_4_ = fVar225 * auVar16._12_4_ + auVar120._12_4_;
  auVar120 = vcvtdq2ps_avx(auVar156);
  auVar16 = vcvtdq2ps_avx(auVar19);
  auVar16 = vsubps_avx(auVar16,auVar120);
  auVar188._0_4_ = fVar152 * auVar16._0_4_ + auVar120._0_4_;
  auVar188._4_4_ = fVar206 * auVar16._4_4_ + auVar120._4_4_;
  auVar188._8_4_ = fVar223 * auVar16._8_4_ + auVar120._8_4_;
  auVar188._12_4_ = fVar225 * auVar16._12_4_ + auVar120._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar85 * 0x12 + 6);
  auVar120 = vpmovsxwd_avx(auVar15);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar85 * 0x16 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar120);
  auVar235._0_4_ = auVar16._0_4_ * fVar152 + auVar120._0_4_;
  auVar235._4_4_ = auVar16._4_4_ * fVar206 + auVar120._4_4_;
  auVar235._8_4_ = auVar16._8_4_ * fVar223 + auVar120._8_4_;
  auVar235._12_4_ = auVar16._12_4_ * fVar225 + auVar120._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar85 * 0x14 + 6);
  auVar120 = vpmovsxwd_avx(auVar21);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar85 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar167);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar120);
  auVar345._0_4_ = auVar16._0_4_ * fVar152 + auVar120._0_4_;
  auVar345._4_4_ = auVar16._4_4_ * fVar206 + auVar120._4_4_;
  auVar345._8_4_ = auVar16._8_4_ * fVar223 + auVar120._8_4_;
  auVar345._12_4_ = auVar16._12_4_ * fVar225 + auVar120._12_4_;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + uVar85 * 0x1d + 6);
  auVar120 = vpmovsxwd_avx(auVar211);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar85 * 0x21 + 6);
  auVar16 = vpmovsxwd_avx(auVar161);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar18 = vsubps_avx(auVar16,auVar120);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar85 * 0x1f + 6);
  auVar16 = vpmovsxwd_avx(auVar100);
  auVar361._0_4_ = auVar18._0_4_ * fVar152 + auVar120._0_4_;
  auVar361._4_4_ = auVar18._4_4_ * fVar206 + auVar120._4_4_;
  auVar361._8_4_ = auVar18._8_4_ * fVar223 + auVar120._8_4_;
  auVar361._12_4_ = auVar18._12_4_ * fVar225 + auVar120._12_4_;
  auVar120 = vcvtdq2ps_avx(auVar16);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar85 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar121);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar120);
  auVar156._0_4_ = auVar120._0_4_ + auVar16._0_4_ * fVar152;
  auVar156._4_4_ = auVar120._4_4_ + auVar16._4_4_ * fVar206;
  auVar156._8_4_ = auVar120._8_4_ + auVar16._8_4_ * fVar223;
  auVar156._12_4_ = auVar120._12_4_ + auVar16._12_4_ * fVar225;
  auVar120 = vsubps_avx(auVar95,auVar293);
  auVar96._0_4_ = fVar271 * auVar120._0_4_;
  auVar96._4_4_ = fVar280 * auVar120._4_4_;
  auVar96._8_4_ = fVar281 * auVar120._8_4_;
  auVar96._12_4_ = fVar283 * auVar120._12_4_;
  auVar120 = vsubps_avx(auVar188,auVar293);
  auVar189._0_4_ = fVar271 * auVar120._0_4_;
  auVar189._4_4_ = fVar280 * auVar120._4_4_;
  auVar189._8_4_ = fVar281 * auVar120._8_4_;
  auVar189._12_4_ = fVar283 * auVar120._12_4_;
  auVar120 = vsubps_avx(auVar235,auVar208);
  auVar236._0_4_ = fVar298 * auVar120._0_4_;
  auVar236._4_4_ = fVar308 * auVar120._4_4_;
  auVar236._8_4_ = fVar311 * auVar120._8_4_;
  auVar236._12_4_ = fVar314 * auVar120._12_4_;
  auVar120 = vsubps_avx(auVar345,auVar208);
  auVar209._0_4_ = fVar298 * auVar120._0_4_;
  auVar209._4_4_ = fVar308 * auVar120._4_4_;
  auVar209._8_4_ = fVar311 * auVar120._8_4_;
  auVar209._12_4_ = fVar314 * auVar120._12_4_;
  auVar120 = vsubps_avx(auVar361,auVar258);
  auVar274._0_4_ = fVar326 * auVar120._0_4_;
  auVar274._4_4_ = fVar331 * auVar120._4_4_;
  auVar274._8_4_ = fVar333 * auVar120._8_4_;
  auVar274._12_4_ = fVar335 * auVar120._12_4_;
  auVar120 = vsubps_avx(auVar156,auVar258);
  auVar157._0_4_ = fVar326 * auVar120._0_4_;
  auVar157._4_4_ = fVar331 * auVar120._4_4_;
  auVar157._8_4_ = fVar333 * auVar120._8_4_;
  auVar157._12_4_ = fVar335 * auVar120._12_4_;
  auVar120 = vpminsd_avx(auVar96,auVar189);
  auVar16 = vpminsd_avx(auVar236,auVar209);
  auVar120 = vmaxps_avx(auVar120,auVar16);
  auVar16 = vpminsd_avx(auVar274,auVar157);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar302._4_4_ = uVar7;
  auVar302._0_4_ = uVar7;
  auVar302._8_4_ = uVar7;
  auVar302._12_4_ = uVar7;
  auVar16 = vmaxps_avx(auVar16,auVar302);
  auVar120 = vmaxps_avx(auVar120,auVar16);
  local_7e0._0_4_ = auVar120._0_4_ * 0.99999964;
  local_7e0._4_4_ = auVar120._4_4_ * 0.99999964;
  local_7e0._8_4_ = auVar120._8_4_ * 0.99999964;
  local_7e0._12_4_ = auVar120._12_4_ * 0.99999964;
  auVar120 = vpmaxsd_avx(auVar96,auVar189);
  auVar16 = vpmaxsd_avx(auVar236,auVar209);
  auVar120 = vminps_avx(auVar120,auVar16);
  auVar16 = vpmaxsd_avx(auVar274,auVar157);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar190._4_4_ = uVar7;
  auVar190._0_4_ = uVar7;
  auVar190._8_4_ = uVar7;
  auVar190._12_4_ = uVar7;
  auVar16 = vminps_avx(auVar16,auVar190);
  auVar120 = vminps_avx(auVar120,auVar16);
  auVar16 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar16 = vpcmpgtd_avx(auVar16,_DAT_01f4ad30);
  auVar97._0_4_ = auVar120._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar120._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar120._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar120._12_4_ * 1.0000004;
  auVar120 = vcmpps_avx(local_7e0,auVar97,2);
  auVar120 = vandps_avx(auVar120,auVar16);
  uVar90 = vmovmskps_avx(auVar120);
  auVar106._16_16_ = mm_lookupmask_ps._240_16_;
  auVar106._0_16_ = mm_lookupmask_ps._240_16_;
  local_5e0 = vblendps_avx(auVar106,ZEXT832(0) << 0x20,0x80);
  uVar88 = 1 << ((byte)k & 0x1f);
  local_aa0 = (undefined1 (*) [32])&local_6e0;
  local_aa8 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar88 & 0xf) << 4));
  local_ab0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar88 >> 4) * 0x10);
  auVar307 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_950 = prim;
LAB_00930c89:
  local_948 = (ulong)uVar90;
  if (local_948 == 0) {
LAB_00933ae3:
    return local_948 != 0;
  }
  lVar91 = 0;
  if (local_948 != 0) {
    for (; (uVar90 >> lVar91 & 1) == 0; lVar91 = lVar91 + 1) {
    }
  }
  local_a98 = (ulong)*(uint *)(local_950 + 2);
  pGVar9 = (context->scene->geometries).items[local_a98].ptr;
  uVar85 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(local_950 + lVar91 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar271 = (pGVar9->time_range).lower;
  fVar271 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar271) / ((pGVar9->time_range).upper - fVar271));
  auVar120 = vroundss_avx(ZEXT416((uint)fVar271),ZEXT416((uint)fVar271),9);
  auVar120 = vminss_avx(auVar120,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar120 = vmaxss_avx(ZEXT816(0) << 0x20,auVar120);
  fVar271 = fVar271 - auVar120._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar92 = (long)(int)auVar120._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar92);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar92);
  auVar120 = vshufps_avx(ZEXT416((uint)(1.0 - fVar271)),ZEXT416((uint)(1.0 - fVar271)),0);
  pfVar1 = (float *)(lVar11 + lVar12 * uVar85);
  fVar333 = auVar120._0_4_;
  fVar283 = auVar120._4_4_;
  fVar314 = auVar120._8_4_;
  fVar335 = auVar120._12_4_;
  pfVar2 = (float *)(lVar11 + lVar12 * (uVar85 + 1));
  pfVar3 = (float *)(lVar11 + lVar12 * (uVar85 + 2));
  pfVar4 = (float *)(lVar11 + lVar12 * (uVar85 + 3));
  lVar11 = *(long *)(_Var10 + 0x38 + lVar92);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar92);
  auVar120 = vshufps_avx(ZEXT416((uint)fVar271),ZEXT416((uint)fVar271),0);
  pfVar5 = (float *)(lVar11 + uVar85 * lVar12);
  fVar152 = auVar120._0_4_;
  fVar206 = auVar120._4_4_;
  fVar223 = auVar120._8_4_;
  fVar225 = auVar120._12_4_;
  pfVar6 = (float *)(lVar11 + (uVar85 + 1) * lVar12);
  auVar210._0_4_ = fVar152 * *pfVar5 + fVar333 * *pfVar1;
  auVar210._4_4_ = fVar206 * pfVar5[1] + fVar283 * pfVar1[1];
  auVar210._8_4_ = fVar223 * pfVar5[2] + fVar314 * pfVar1[2];
  auVar210._12_4_ = fVar225 * pfVar5[3] + fVar335 * pfVar1[3];
  auVar120 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar16 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar271 = *(float *)(ray + k * 4 + 0x80);
  auVar362._4_4_ = fVar271;
  auVar362._0_4_ = fVar271;
  auVar362._8_4_ = fVar271;
  auVar362._12_4_ = fVar271;
  fStack_870 = fVar271;
  _local_880 = auVar362;
  fStack_86c = fVar271;
  fStack_868 = fVar271;
  fStack_864 = fVar271;
  fVar298 = *(float *)(ray + k * 4 + 0xa0);
  auVar386._4_4_ = fVar298;
  auVar386._0_4_ = fVar298;
  auVar386._8_4_ = fVar298;
  auVar386._12_4_ = fVar298;
  fStack_890 = fVar298;
  _local_8a0 = auVar386;
  fStack_88c = fVar298;
  fStack_888 = fVar298;
  fStack_884 = fVar298;
  auVar237._0_4_ = fVar333 * *pfVar2 + fVar152 * *pfVar6;
  auVar237._4_4_ = fVar283 * pfVar2[1] + fVar206 * pfVar6[1];
  auVar237._8_4_ = fVar314 * pfVar2[2] + fVar223 * pfVar6[2];
  auVar237._12_4_ = fVar335 * pfVar2[3] + fVar225 * pfVar6[3];
  auVar120 = vunpcklps_avx(auVar362,auVar386);
  fVar326 = *(float *)(ray + k * 4 + 0xc0);
  auVar397._4_4_ = fVar326;
  auVar397._0_4_ = fVar326;
  auVar397._8_4_ = fVar326;
  auVar397._12_4_ = fVar326;
  fStack_8b0 = fVar326;
  _local_8c0 = auVar397;
  fStack_8ac = fVar326;
  fStack_8a8 = fVar326;
  fStack_8a4 = fVar326;
  _local_9b0 = vinsertps_avx(auVar120,auVar397,0x28);
  auVar98._0_4_ = (auVar210._0_4_ + auVar237._0_4_) * 0.5;
  auVar98._4_4_ = (auVar210._4_4_ + auVar237._4_4_) * 0.5;
  auVar98._8_4_ = (auVar210._8_4_ + auVar237._8_4_) * 0.5;
  auVar98._12_4_ = (auVar210._12_4_ + auVar237._12_4_) * 0.5;
  auVar120 = vsubps_avx(auVar98,auVar16);
  auVar120 = vdpps_avx(auVar120,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar349 = ZEXT1664(local_9c0);
  pfVar1 = (float *)(lVar11 + (uVar85 + 2) * lVar12);
  auVar191._0_4_ = fVar333 * *pfVar3 + fVar152 * *pfVar1;
  auVar191._4_4_ = fVar283 * pfVar3[1] + fVar206 * pfVar1[1];
  auVar191._8_4_ = fVar314 * pfVar3[2] + fVar223 * pfVar1[2];
  auVar191._12_4_ = fVar335 * pfVar3[3] + fVar225 * pfVar1[3];
  auVar18 = vrcpss_avx(local_9c0,local_9c0);
  fVar311 = auVar120._0_4_ * (2.0 - local_9c0._0_4_ * auVar18._0_4_) * auVar18._0_4_;
  auVar297 = ZEXT464((uint)fVar311);
  auVar120 = vshufps_avx(ZEXT416((uint)fVar311),ZEXT416((uint)fVar311),0);
  fVar280 = auVar120._0_4_;
  fVar308 = auVar120._4_4_;
  fVar331 = auVar120._8_4_;
  fVar281 = auVar120._12_4_;
  auVar259._0_4_ = auVar16._0_4_ + local_9b0._0_4_ * fVar280;
  auVar259._4_4_ = auVar16._4_4_ + local_9b0._4_4_ * fVar308;
  auVar259._8_4_ = auVar16._8_4_ + local_9b0._8_4_ * fVar331;
  auVar259._12_4_ = auVar16._12_4_ + local_9b0._12_4_ * fVar281;
  auVar120 = vblendps_avx(auVar259,_DAT_01f45a50,8);
  auVar15 = vsubps_avx(auVar210,auVar120);
  auVar20 = vsubps_avx(auVar191,auVar120);
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar85 + 3));
  auVar119._0_4_ = fVar333 * *pfVar4 + fVar152 * *pfVar1;
  auVar119._4_4_ = fVar283 * pfVar4[1] + fVar206 * pfVar1[1];
  auVar119._8_4_ = fVar314 * pfVar4[2] + fVar223 * pfVar1[2];
  auVar119._12_4_ = fVar335 * pfVar4[3] + fVar225 * pfVar1[3];
  auVar21 = vsubps_avx(auVar237,auVar120);
  _local_af0 = vsubps_avx(auVar119,auVar120);
  auVar120 = vshufps_avx(auVar15,auVar15,0);
  register0x00001250 = auVar120;
  _local_4c0 = auVar120;
  auVar120 = vshufps_avx(auVar15,auVar15,0x55);
  register0x00001250 = auVar120;
  _local_1e0 = auVar120;
  auVar120 = vshufps_avx(auVar15,auVar15,0xaa);
  register0x00001250 = auVar120;
  _local_200 = auVar120;
  auVar120 = vshufps_avx(auVar15,auVar15,0xff);
  register0x00001290 = auVar120;
  _local_220 = auVar120;
  auVar120 = vshufps_avx(auVar21,auVar21,0);
  register0x00001290 = auVar120;
  _local_4e0 = auVar120;
  auVar120 = vshufps_avx(auVar21,auVar21,0x55);
  register0x00001290 = auVar120;
  _local_500 = auVar120;
  auVar120 = vshufps_avx(auVar21,auVar21,0xaa);
  register0x00001290 = auVar120;
  _local_520 = auVar120;
  auVar120 = vshufps_avx(auVar21,auVar21,0xff);
  register0x00001290 = auVar120;
  _local_540 = auVar120;
  auVar16 = vshufps_avx(auVar20,auVar20,0);
  auVar120 = vshufps_avx(auVar20,auVar20,0x55);
  register0x00001290 = auVar120;
  _local_560 = auVar120;
  auVar120 = vshufps_avx(auVar20,auVar20,0xaa);
  register0x00001290 = auVar120;
  _local_580 = auVar120;
  auVar120 = vshufps_avx(auVar20,auVar20,0xff);
  register0x00001290 = auVar120;
  _local_5a0 = auVar120;
  auVar120 = vshufps_avx(_local_af0,_local_af0,0);
  local_320._16_16_ = auVar120;
  local_320._0_16_ = auVar120;
  auVar18 = vshufps_avx(_local_af0,_local_af0,0x55);
  auVar120 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar120;
  _local_5c0 = auVar120;
  auVar120 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar120;
  _local_240 = auVar120;
  auVar120 = ZEXT416((uint)(fVar271 * fVar271 + fVar298 * fVar298 + fVar326 * fVar326));
  auVar120 = vshufps_avx(auVar120,auVar120,0);
  local_260._16_16_ = auVar120;
  local_260._0_16_ = auVar120;
  auVar222 = ZEXT3264(local_260);
  fVar271 = *(float *)(ray + k * 4 + 0x60);
  local_960 = ZEXT416((uint)fVar311);
  auVar120 = vshufps_avx(ZEXT416((uint)(fVar271 - fVar311)),ZEXT416((uint)(fVar271 - fVar311)),0);
  local_340._16_16_ = auVar120;
  local_340._0_16_ = auVar120;
  auVar120 = vpshufd_avx(ZEXT416(*(uint *)(local_950 + 2)),0);
  local_640._16_16_ = auVar120;
  local_640._0_16_ = auVar120;
  auVar120 = vpshufd_avx(ZEXT416(*(uint *)(local_950 + lVar91 * 4 + 6)),0);
  local_660._16_16_ = auVar120;
  local_660._0_16_ = auVar120;
  uVar85 = 0;
  bVar89 = 0;
  local_d24 = 1;
  local_620 = vandps_avx(auVar307._0_32_,local_260);
  auVar120 = vsqrtss_avx(local_9c0,local_9c0);
  auVar19 = vsqrtss_avx(local_9c0,local_9c0);
  local_7d0 = ZEXT816(0x3f80000000000000);
  do {
    auVar243._8_4_ = 0x3f800000;
    auVar243._0_8_ = 0x3f8000003f800000;
    auVar243._12_4_ = 0x3f800000;
    auVar243._16_4_ = 0x3f800000;
    auVar243._20_4_ = 0x3f800000;
    auVar243._24_4_ = 0x3f800000;
    auVar243._28_4_ = 0x3f800000;
    auVar167 = vmovshdup_avx(local_7d0);
    auVar161 = vsubps_avx(auVar167,local_7d0);
    auVar167 = vshufps_avx(local_7d0,local_7d0,0);
    local_900._16_16_ = auVar167;
    local_900._0_16_ = auVar167;
    auVar211 = vshufps_avx(auVar161,auVar161,0);
    local_920._16_16_ = auVar211;
    local_920._0_16_ = auVar211;
    fVar230 = auVar211._0_4_;
    fVar232 = auVar211._4_4_;
    fVar342 = auVar211._8_4_;
    fVar352 = auVar211._12_4_;
    fVar224 = auVar167._0_4_;
    auVar202._0_4_ = fVar224 + fVar230 * 0.0;
    fVar226 = auVar167._4_4_;
    auVar202._4_4_ = fVar226 + fVar232 * 0.14285715;
    fVar228 = auVar167._8_4_;
    auVar202._8_4_ = fVar228 + fVar342 * 0.2857143;
    fStack_a44 = auVar167._12_4_;
    auVar202._12_4_ = fStack_a44 + fVar352 * 0.42857146;
    auVar202._16_4_ = fVar224 + fVar230 * 0.5714286;
    auVar202._20_4_ = fVar226 + fVar232 * 0.71428573;
    auVar202._24_4_ = fVar228 + fVar342 * 0.8571429;
    auVar202._28_4_ = fStack_a44 + fVar352;
    auVar106 = vsubps_avx(auVar243,auVar202);
    local_a60._4_4_ = auVar202._4_4_ * auVar202._4_4_;
    local_a60._0_4_ = auVar202._0_4_ * auVar202._0_4_;
    fStack_a58 = auVar202._8_4_ * auVar202._8_4_;
    fStack_a54 = auVar202._12_4_ * auVar202._12_4_;
    fStack_a50 = auVar202._16_4_ * auVar202._16_4_;
    fStack_a4c = auVar202._20_4_ * auVar202._20_4_;
    fStack_a48 = auVar202._24_4_ * auVar202._24_4_;
    fVar206 = auVar202._0_4_ * 3.0;
    fVar223 = auVar202._4_4_ * 3.0;
    fVar225 = auVar202._8_4_ * 3.0;
    fVar227 = auVar202._12_4_ * 3.0;
    fVar229 = auVar202._16_4_ * 3.0;
    fVar231 = auVar202._20_4_ * 3.0;
    fVar233 = auVar202._24_4_ * 3.0;
    fVar292 = auVar222._28_4_ + -5.0;
    fVar298 = auVar106._0_4_;
    auVar307._0_4_ = fVar298 * fVar298;
    fVar326 = auVar106._4_4_;
    auVar307._4_4_ = fVar326 * fVar326;
    fVar311 = auVar106._8_4_;
    auVar307._8_4_ = fVar311 * fVar311;
    fVar333 = auVar106._12_4_;
    auVar307._12_4_ = fVar333 * fVar333;
    fVar283 = auVar106._16_4_;
    auVar307._16_4_ = fVar283 * fVar283;
    fVar314 = auVar106._20_4_;
    auVar307._20_4_ = fVar314 * fVar314;
    fVar335 = auVar106._24_4_;
    auVar307._28_36_ = auVar297._28_36_;
    auVar307._24_4_ = fVar335 * fVar335;
    fVar152 = auVar106._28_4_;
    fVar234 = (auVar307._0_4_ * (fVar298 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar251 = (auVar307._4_4_ * (fVar326 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar252 = (auVar307._8_4_ * (fVar311 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar253 = (auVar307._12_4_ * (fVar333 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar254 = (auVar307._16_4_ * (fVar283 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar255 = (auVar307._20_4_ * (fVar314 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar256 = (auVar307._24_4_ * (fVar335 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar299 = -fVar298 * auVar202._0_4_ * auVar202._0_4_ * 0.5;
    fVar309 = -fVar326 * auVar202._4_4_ * auVar202._4_4_ * 0.5;
    fVar312 = -fVar311 * auVar202._8_4_ * auVar202._8_4_ * 0.5;
    fVar315 = -fVar333 * auVar202._12_4_ * auVar202._12_4_ * 0.5;
    fVar317 = -fVar283 * auVar202._16_4_ * auVar202._16_4_ * 0.5;
    fVar319 = -fVar314 * auVar202._20_4_ * auVar202._20_4_ * 0.5;
    fVar322 = -fVar335 * auVar202._24_4_ * auVar202._24_4_ * 0.5;
    fVar321 = auVar18._0_4_;
    fVar324 = auVar18._4_4_;
    fVar146 = auVar18._8_4_;
    fVar148 = auVar18._12_4_;
    fVar179 = auVar16._0_4_;
    fVar182 = auVar16._4_4_;
    fVar185 = auVar16._8_4_;
    fVar272 = auVar16._12_4_;
    fVar340 = local_320._28_4_ + fVar272;
    fVar357 = auVar349._28_4_ + fVar272;
    fVar384 = (auVar202._0_4_ * auVar202._0_4_ * (fVar206 + -5.0) + 2.0) * 0.5;
    fVar388 = (auVar202._4_4_ * auVar202._4_4_ * (fVar223 + -5.0) + 2.0) * 0.5;
    fVar389 = (auVar202._8_4_ * auVar202._8_4_ * (fVar225 + -5.0) + 2.0) * 0.5;
    fVar390 = (auVar202._12_4_ * auVar202._12_4_ * (fVar227 + -5.0) + 2.0) * 0.5;
    fVar391 = (auVar202._16_4_ * auVar202._16_4_ * (fVar229 + -5.0) + 2.0) * 0.5;
    fVar392 = (auVar202._20_4_ * auVar202._20_4_ * (fVar231 + -5.0) + 2.0) * 0.5;
    fVar393 = (auVar202._24_4_ * auVar202._24_4_ * (fVar233 + -5.0) + 2.0) * 0.5;
    fVar383 = -auVar202._28_4_;
    fVar358 = -auVar202._0_4_ * fVar298 * fVar298 * 0.5;
    fVar365 = -auVar202._4_4_ * fVar326 * fVar326 * 0.5;
    fVar368 = -auVar202._8_4_ * fVar311 * fVar311 * 0.5;
    fVar371 = -auVar202._12_4_ * fVar333 * fVar333 * 0.5;
    fVar374 = -auVar202._16_4_ * fVar283 * fVar283 * 0.5;
    fVar377 = -auVar202._20_4_ * fVar314 * fVar314 * 0.5;
    fVar380 = -auVar202._24_4_ * fVar335 * fVar335 * 0.5;
    local_9a0 = fVar358 * (float)local_4c0._0_4_ +
                fVar384 * (float)local_4e0._0_4_ + local_320._0_4_ * fVar299 + fVar179 * fVar234;
    fStack_99c = fVar365 * (float)local_4c0._4_4_ +
                 fVar388 * (float)local_4e0._4_4_ + local_320._4_4_ * fVar309 + fVar182 * fVar251;
    fStack_998 = fVar368 * fStack_4b8 +
                 fVar389 * fStack_4d8 + local_320._8_4_ * fVar312 + fVar185 * fVar252;
    fStack_994 = fVar371 * fStack_4b4 +
                 fVar390 * fStack_4d4 + local_320._12_4_ * fVar315 + fVar272 * fVar253;
    fStack_990 = fVar374 * fStack_4b0 +
                 fVar391 * fStack_4d0 + local_320._16_4_ * fVar317 + fVar179 * fVar254;
    fStack_98c = fVar377 * fStack_4ac +
                 fVar392 * fStack_4cc + local_320._20_4_ * fVar319 + fVar182 * fVar255;
    fStack_988 = fVar380 * fStack_4a8 +
                 fVar393 * fStack_4c8 + local_320._24_4_ * fVar322 + fVar185 * fVar256;
    fStack_984 = fVar272 + 2.0 + -fVar152 + fVar340;
    fVar300 = (float)local_1e0._0_4_ * fVar358 +
              fVar384 * (float)local_500._0_4_ +
              fVar321 * fVar299 + fVar234 * (float)local_560._0_4_;
    fVar310 = (float)local_1e0._4_4_ * fVar365 +
              fVar388 * (float)local_500._4_4_ +
              fVar324 * fVar309 + fVar251 * (float)local_560._4_4_;
    fVar313 = fStack_1d8 * fVar368 + fVar389 * fStack_4f8 + fVar146 * fVar312 + fVar252 * fStack_558
    ;
    fVar316 = fStack_1d4 * fVar371 + fVar390 * fStack_4f4 + fVar148 * fVar315 + fVar253 * fStack_554
    ;
    fVar318 = fStack_1d0 * fVar374 + fVar391 * fStack_4f0 + fVar321 * fVar317 + fVar254 * fStack_550
    ;
    fVar320 = fStack_1cc * fVar377 + fVar392 * fStack_4ec + fVar324 * fVar319 + fVar255 * fStack_54c
    ;
    fVar323 = fStack_1c8 * fVar380 + fVar393 * fStack_4e8 + fVar146 * fVar322 + fVar256 * fStack_548
    ;
    fVar325 = fStack_984 + fVar340 + fVar357;
    fVar153 = (float)local_200._0_4_ * fVar358 +
              fVar384 * (float)local_520._0_4_ +
              fVar299 * (float)local_5c0._0_4_ + fVar234 * (float)local_580._0_4_;
    fVar178 = (float)local_200._4_4_ * fVar365 +
              fVar388 * (float)local_520._4_4_ +
              fVar309 * (float)local_5c0._4_4_ + fVar251 * (float)local_580._4_4_;
    fVar180 = fStack_1f8 * fVar368 +
              fVar389 * fStack_518 + fVar312 * fStack_5b8 + fVar252 * fStack_578;
    fVar181 = fStack_1f4 * fVar371 +
              fVar390 * fStack_514 + fVar315 * fStack_5b4 + fVar253 * fStack_574;
    fVar183 = fStack_1f0 * fVar374 +
              fVar391 * fStack_510 + fVar317 * fStack_5b0 + fVar254 * fStack_570;
    fVar184 = fStack_1ec * fVar377 +
              fVar392 * fStack_50c + fVar319 * fStack_5ac + fVar255 * fStack_56c;
    fVar186 = fStack_1e8 * fVar380 +
              fVar393 * fStack_508 + fVar322 * fStack_5a8 + fVar256 * fStack_568;
    fVar187 = fVar325 + fVar357 + fVar148 + fVar272;
    auVar244._0_4_ =
         (float)local_220._0_4_ * fVar358 +
         fVar384 * (float)local_540._0_4_ +
         fVar299 * (float)local_240._0_4_ + fVar234 * (float)local_5a0._0_4_;
    auVar244._4_4_ =
         (float)local_220._4_4_ * fVar365 +
         fVar388 * (float)local_540._4_4_ +
         fVar309 * (float)local_240._4_4_ + fVar251 * (float)local_5a0._4_4_;
    auVar244._8_4_ =
         fStack_218 * fVar368 + fVar389 * fStack_538 + fVar312 * fStack_238 + fVar252 * fStack_598;
    auVar244._12_4_ =
         fStack_214 * fVar371 + fVar390 * fStack_534 + fVar315 * fStack_234 + fVar253 * fStack_594;
    auVar244._16_4_ =
         fStack_210 * fVar374 + fVar391 * fStack_530 + fVar317 * fStack_230 + fVar254 * fStack_590;
    auVar244._20_4_ =
         fStack_20c * fVar377 + fVar392 * fStack_52c + fVar319 * fStack_22c + fVar255 * fStack_58c;
    auVar244._24_4_ =
         fStack_208 * fVar380 + fVar393 * fStack_528 + fVar322 * fStack_228 + fVar256 * fStack_588;
    auVar244._28_4_ = fVar325 + fVar272 + 2.0 + -fVar152 + -3.0;
    fVar371 = auVar202._28_4_ + auVar202._28_4_;
    auVar26._4_4_ = (fVar326 + fVar326) * auVar202._4_4_;
    auVar26._0_4_ = (fVar298 + fVar298) * auVar202._0_4_;
    auVar26._8_4_ = (fVar311 + fVar311) * auVar202._8_4_;
    auVar26._12_4_ = (fVar333 + fVar333) * auVar202._12_4_;
    auVar26._16_4_ = (fVar283 + fVar283) * auVar202._16_4_;
    auVar26._20_4_ = (fVar314 + fVar314) * auVar202._20_4_;
    auVar26._24_4_ = (fVar335 + fVar335) * auVar202._24_4_;
    auVar26._28_4_ = fVar371;
    auVar106 = vsubps_avx(auVar26,auVar307._0_32_);
    fVar255 = auVar222._28_4_ + 2.0;
    auVar25._4_4_ = (fVar326 + fVar326) * (fVar223 + 2.0);
    auVar25._0_4_ = (fVar298 + fVar298) * (fVar206 + 2.0);
    auVar25._8_4_ = (fVar311 + fVar311) * (fVar225 + 2.0);
    auVar25._12_4_ = (fVar333 + fVar333) * (fVar227 + 2.0);
    auVar25._16_4_ = (fVar283 + fVar283) * (fVar229 + 2.0);
    auVar25._20_4_ = (fVar314 + fVar314) * (fVar231 + 2.0);
    auVar25._24_4_ = (fVar335 + fVar335) * (fVar233 + 2.0);
    auVar25._28_4_ = fVar255;
    auVar22._4_4_ = fVar326 * fVar326 * 3.0;
    auVar22._0_4_ = fVar298 * fVar298 * 3.0;
    auVar22._8_4_ = fVar311 * fVar311 * 3.0;
    auVar22._12_4_ = fVar333 * fVar333 * 3.0;
    auVar22._16_4_ = fVar283 * fVar283 * 3.0;
    auVar22._20_4_ = fVar314 * fVar314 * 3.0;
    auVar22._24_4_ = fVar335 * fVar335 * 3.0;
    auVar22._28_4_ = fVar152;
    auVar25 = vsubps_avx(auVar25,auVar22);
    auVar26 = vsubps_avx(_local_a60,auVar26);
    fVar319 = auVar106._0_4_ * 0.5;
    fVar322 = auVar106._4_4_ * 0.5;
    fVar340 = auVar106._8_4_ * 0.5;
    fVar357 = auVar106._12_4_ * 0.5;
    fVar358 = auVar106._16_4_ * 0.5;
    fVar365 = auVar106._20_4_ * 0.5;
    fVar368 = auVar106._24_4_ * 0.5;
    fVar253 = (auVar202._0_4_ * fVar206 + (auVar202._0_4_ + auVar202._0_4_) * (fVar206 + -5.0)) *
              0.5;
    fVar256 = (auVar202._4_4_ * fVar223 + (auVar202._4_4_ + auVar202._4_4_) * (fVar223 + -5.0)) *
              0.5;
    fVar299 = (auVar202._8_4_ * fVar225 + (auVar202._8_4_ + auVar202._8_4_) * (fVar225 + -5.0)) *
              0.5;
    fVar309 = (auVar202._12_4_ * fVar227 + (auVar202._12_4_ + auVar202._12_4_) * (fVar227 + -5.0)) *
              0.5;
    fVar312 = (auVar202._16_4_ * fVar229 + (auVar202._16_4_ + auVar202._16_4_) * (fVar229 + -5.0)) *
              0.5;
    fVar315 = (auVar202._20_4_ * fVar231 + (auVar202._20_4_ + auVar202._20_4_) * (fVar231 + -5.0)) *
              0.5;
    fVar317 = (auVar202._24_4_ * fVar233 + (auVar202._24_4_ + auVar202._24_4_) * (fVar233 + -5.0)) *
              0.5;
    fVar298 = auVar25._0_4_ * 0.5;
    fVar326 = auVar25._4_4_ * 0.5;
    fVar311 = auVar25._8_4_ * 0.5;
    fVar333 = auVar25._12_4_ * 0.5;
    fVar335 = auVar25._16_4_ * 0.5;
    fVar206 = auVar25._20_4_ * 0.5;
    fVar227 = auVar25._24_4_ * 0.5;
    fVar283 = auVar26._0_4_ * 0.5;
    fVar314 = auVar26._4_4_ * 0.5;
    fVar223 = auVar26._8_4_ * 0.5;
    fVar229 = auVar26._12_4_ * 0.5;
    fVar231 = auVar26._16_4_ * 0.5;
    fVar251 = auVar26._20_4_ * 0.5;
    fVar252 = auVar26._24_4_ * 0.5;
    fVar255 = fVar255 + auVar202._28_4_ + fVar292 + auVar25._28_4_ + auVar26._28_4_;
    auVar167 = vpermilps_avx(ZEXT416((uint)(auVar161._0_4_ * 0.04761905)),0);
    fVar233 = auVar167._0_4_;
    fVar390 = fVar233 * (fVar319 * (float)local_4c0._0_4_ +
                        fVar253 * (float)local_4e0._0_4_ +
                        fVar298 * fVar179 + local_320._0_4_ * fVar283);
    fVar234 = auVar167._4_4_;
    fVar391 = fVar234 * (fVar322 * (float)local_4c0._4_4_ +
                        fVar256 * (float)local_4e0._4_4_ +
                        fVar326 * fVar182 + local_320._4_4_ * fVar314);
    auVar30._4_4_ = fVar391;
    auVar30._0_4_ = fVar390;
    fVar254 = auVar167._8_4_;
    fVar393 = fVar254 * (fVar340 * fStack_4b8 +
                        fVar299 * fStack_4d8 + fVar311 * fVar185 + local_320._8_4_ * fVar223);
    auVar30._8_4_ = fVar393;
    fVar225 = auVar167._12_4_;
    fVar284 = fVar225 * (fVar357 * fStack_4b4 +
                        fVar309 * fStack_4d4 + fVar333 * fVar272 + local_320._12_4_ * fVar229);
    auVar30._12_4_ = fVar284;
    fVar286 = fVar233 * (fVar358 * fStack_4b0 +
                        fVar312 * fStack_4d0 + fVar335 * fVar179 + local_320._16_4_ * fVar231);
    auVar30._16_4_ = fVar286;
    fVar288 = fVar234 * (fVar365 * fStack_4ac +
                        fVar315 * fStack_4cc + fVar206 * fVar182 + local_320._20_4_ * fVar251);
    auVar30._20_4_ = fVar288;
    fVar290 = fVar254 * (fVar368 * fStack_4a8 +
                        fVar317 * fStack_4c8 + fVar227 * fVar185 + local_320._24_4_ * fVar252);
    auVar30._24_4_ = fVar290;
    auVar30._28_4_ = fVar152 + fVar152 + auVar106._28_4_ + fVar152 + fVar152 + fVar292;
    fVar341 = fVar233 * ((float)local_1e0._0_4_ * fVar319 +
                        fVar253 * (float)local_500._0_4_ +
                        fVar298 * (float)local_560._0_4_ + fVar283 * fVar321);
    fVar350 = fVar234 * ((float)local_1e0._4_4_ * fVar322 +
                        fVar256 * (float)local_500._4_4_ +
                        fVar326 * (float)local_560._4_4_ + fVar314 * fVar324);
    auVar306._4_4_ = fVar350;
    auVar306._0_4_ = fVar341;
    fVar351 = fVar254 * (fStack_1d8 * fVar340 +
                        fVar299 * fStack_4f8 + fVar311 * fStack_558 + fVar223 * fVar146);
    auVar306._8_4_ = fVar351;
    fVar353 = fVar225 * (fStack_1d4 * fVar357 +
                        fVar309 * fStack_4f4 + fVar333 * fStack_554 + fVar229 * fVar148);
    auVar306._12_4_ = fVar353;
    fVar354 = fVar233 * (fStack_1d0 * fVar358 +
                        fVar312 * fStack_4f0 + fVar335 * fStack_550 + fVar231 * fVar321);
    auVar306._16_4_ = fVar354;
    fVar355 = fVar234 * (fStack_1cc * fVar365 +
                        fVar315 * fStack_4ec + fVar206 * fStack_54c + fVar251 * fVar324);
    auVar306._20_4_ = fVar355;
    fVar356 = fVar254 * (fStack_1c8 * fVar368 +
                        fVar317 * fStack_4e8 + fVar227 * fStack_548 + fVar252 * fVar146);
    auVar306._24_4_ = fVar356;
    auVar306._28_4_ = fStack_1e4;
    fVar359 = fVar233 * ((float)local_200._0_4_ * fVar319 +
                        fVar298 * (float)local_580._0_4_ + fVar283 * (float)local_5c0._0_4_ +
                        fVar253 * (float)local_520._0_4_);
    fVar366 = fVar234 * ((float)local_200._4_4_ * fVar322 +
                        fVar326 * (float)local_580._4_4_ + fVar314 * (float)local_5c0._4_4_ +
                        fVar256 * (float)local_520._4_4_);
    auVar31._4_4_ = fVar366;
    auVar31._0_4_ = fVar359;
    fVar369 = fVar254 * (fStack_1f8 * fVar340 +
                        fVar311 * fStack_578 + fVar223 * fStack_5b8 + fVar299 * fStack_518);
    auVar31._8_4_ = fVar369;
    fVar372 = fVar225 * (fStack_1f4 * fVar357 +
                        fVar333 * fStack_574 + fVar229 * fStack_5b4 + fVar309 * fStack_514);
    auVar31._12_4_ = fVar372;
    fVar375 = fVar233 * (fStack_1f0 * fVar358 +
                        fVar335 * fStack_570 + fVar231 * fStack_5b0 + fVar312 * fStack_510);
    auVar31._16_4_ = fVar375;
    fVar378 = fVar234 * (fStack_1ec * fVar365 +
                        fVar206 * fStack_56c + fVar251 * fStack_5ac + fVar315 * fStack_50c);
    auVar31._20_4_ = fVar378;
    fVar381 = fVar254 * (fStack_1e8 * fVar368 +
                        fVar227 * fStack_568 + fVar252 * fStack_5a8 + fVar317 * fStack_508);
    auVar31._24_4_ = fVar381;
    auVar31._28_4_ = fVar383;
    fVar283 = fVar233 * ((float)local_220._0_4_ * fVar319 +
                        fVar253 * (float)local_540._0_4_ +
                        fVar298 * (float)local_5a0._0_4_ + (float)local_240._0_4_ * fVar283);
    fVar314 = fVar234 * ((float)local_220._4_4_ * fVar322 +
                        fVar256 * (float)local_540._4_4_ +
                        fVar326 * (float)local_5a0._4_4_ + (float)local_240._4_4_ * fVar314);
    auVar23._4_4_ = fVar314;
    auVar23._0_4_ = fVar283;
    fVar223 = fVar254 * (fStack_218 * fVar340 +
                        fVar299 * fStack_538 + fVar311 * fStack_598 + fStack_238 * fVar223);
    auVar23._8_4_ = fVar223;
    fVar225 = fVar225 * (fStack_214 * fVar357 +
                        fVar309 * fStack_534 + fVar333 * fStack_594 + fStack_234 * fVar229);
    auVar23._12_4_ = fVar225;
    fVar233 = fVar233 * (fStack_210 * fVar358 +
                        fVar312 * fStack_530 + fVar335 * fStack_590 + fStack_230 * fVar231);
    auVar23._16_4_ = fVar233;
    fVar234 = fVar234 * (fStack_20c * fVar365 +
                        fVar315 * fStack_52c + fVar206 * fStack_58c + fStack_22c * fVar251);
    auVar23._20_4_ = fVar234;
    fVar254 = fVar254 * (fStack_208 * fVar368 +
                        fVar317 * fStack_528 + fVar227 * fStack_588 + fStack_228 * fVar252);
    auVar23._24_4_ = fVar254;
    auVar23._28_4_ = fVar255;
    auVar79._4_4_ = fVar310;
    auVar79._0_4_ = fVar300;
    auVar79._8_4_ = fVar313;
    auVar79._12_4_ = fVar316;
    auVar79._16_4_ = fVar318;
    auVar79._20_4_ = fVar320;
    auVar79._24_4_ = fVar323;
    auVar79._28_4_ = fVar325;
    auVar106 = vperm2f128_avx(auVar79,auVar79,1);
    auVar106 = vshufps_avx(auVar106,auVar79,0x30);
    auVar22 = vshufps_avx(auVar79,auVar106,0x29);
    auVar77._4_4_ = fVar178;
    auVar77._0_4_ = fVar153;
    auVar77._8_4_ = fVar180;
    auVar77._12_4_ = fVar181;
    auVar77._16_4_ = fVar183;
    auVar77._20_4_ = fVar184;
    auVar77._24_4_ = fVar186;
    auVar77._28_4_ = fVar187;
    auVar106 = vperm2f128_avx(auVar77,auVar77,1);
    auVar106 = vshufps_avx(auVar106,auVar77,0x30);
    auVar202 = vshufps_avx(auVar77,auVar106,0x29);
    auVar25 = vsubps_avx(auVar244,auVar23);
    auVar106 = vperm2f128_avx(auVar25,auVar25,1);
    auVar106 = vshufps_avx(auVar106,auVar25,0x30);
    auVar23 = vshufps_avx(auVar25,auVar106,0x29);
    local_2a0 = vsubps_avx(auVar22,auVar79);
    local_280 = vsubps_avx(auVar202,auVar77);
    fVar326 = local_2a0._0_4_;
    fVar335 = local_2a0._4_4_;
    auVar24._4_4_ = fVar366 * fVar335;
    auVar24._0_4_ = fVar359 * fVar326;
    fVar227 = local_2a0._8_4_;
    auVar24._8_4_ = fVar369 * fVar227;
    fVar251 = local_2a0._12_4_;
    auVar24._12_4_ = fVar372 * fVar251;
    fVar256 = local_2a0._16_4_;
    auVar24._16_4_ = fVar375 * fVar256;
    fVar317 = local_2a0._20_4_;
    auVar24._20_4_ = fVar378 * fVar317;
    fVar358 = local_2a0._24_4_;
    auVar24._24_4_ = fVar381 * fVar358;
    auVar24._28_4_ = auVar25._28_4_;
    fVar311 = local_280._0_4_;
    fVar152 = local_280._4_4_;
    auVar27._4_4_ = fVar350 * fVar152;
    auVar27._0_4_ = fVar341 * fVar311;
    fVar229 = local_280._8_4_;
    auVar27._8_4_ = fVar351 * fVar229;
    fVar252 = local_280._12_4_;
    auVar27._12_4_ = fVar353 * fVar252;
    fVar299 = local_280._16_4_;
    auVar27._16_4_ = fVar354 * fVar299;
    fVar319 = local_280._20_4_;
    auVar27._20_4_ = fVar355 * fVar319;
    fVar365 = local_280._24_4_;
    auVar27._24_4_ = fVar356 * fVar365;
    auVar27._28_4_ = auVar106._28_4_;
    auVar27 = vsubps_avx(auVar27,auVar24);
    auVar81._4_4_ = fStack_99c;
    auVar81._0_4_ = local_9a0;
    auVar81._8_4_ = fStack_998;
    auVar81._12_4_ = fStack_994;
    auVar81._16_4_ = fStack_990;
    auVar81._20_4_ = fStack_98c;
    auVar81._24_4_ = fStack_988;
    auVar81._28_4_ = fStack_984;
    auVar106 = vperm2f128_avx(auVar81,auVar81,1);
    auVar106 = vshufps_avx(auVar106,auVar81,0x30);
    auVar24 = vshufps_avx(auVar81,auVar106,0x29);
    local_600 = vsubps_avx(auVar24,auVar81);
    auVar305._4_4_ = fVar391 * fVar152;
    auVar305._0_4_ = fVar390 * fVar311;
    auVar305._8_4_ = fVar393 * fVar229;
    auVar305._12_4_ = fVar284 * fVar252;
    auVar305._16_4_ = fVar286 * fVar299;
    auVar305._20_4_ = fVar288 * fVar319;
    auVar305._24_4_ = fVar290 * fVar365;
    auVar305._28_4_ = auVar106._28_4_;
    fVar333 = local_600._0_4_;
    fVar206 = local_600._4_4_;
    auVar28._4_4_ = fVar366 * fVar206;
    auVar28._0_4_ = fVar359 * fVar333;
    fVar231 = local_600._8_4_;
    auVar28._8_4_ = fVar369 * fVar231;
    fVar253 = local_600._12_4_;
    auVar28._12_4_ = fVar372 * fVar253;
    fVar309 = local_600._16_4_;
    auVar28._16_4_ = fVar375 * fVar309;
    fVar322 = local_600._20_4_;
    auVar28._20_4_ = fVar378 * fVar322;
    fVar368 = local_600._24_4_;
    auVar28._24_4_ = fVar381 * fVar368;
    auVar28._28_4_ = fVar187;
    auVar305 = vsubps_avx(auVar28,auVar305);
    auVar29._4_4_ = fVar350 * fVar206;
    auVar29._0_4_ = fVar341 * fVar333;
    auVar29._8_4_ = fVar351 * fVar231;
    auVar29._12_4_ = fVar353 * fVar253;
    auVar29._16_4_ = fVar354 * fVar309;
    auVar29._20_4_ = fVar355 * fVar322;
    auVar29._24_4_ = fVar356 * fVar368;
    auVar29._28_4_ = fVar187;
    auVar32._4_4_ = fVar335 * fVar391;
    auVar32._0_4_ = fVar326 * fVar390;
    auVar32._8_4_ = fVar227 * fVar393;
    auVar32._12_4_ = fVar251 * fVar284;
    auVar32._16_4_ = fVar256 * fVar286;
    auVar32._20_4_ = fVar317 * fVar288;
    auVar32._24_4_ = fVar358 * fVar290;
    auVar32._28_4_ = fVar371;
    auVar28 = vsubps_avx(auVar32,auVar29);
    fVar298 = auVar28._28_4_;
    auVar203._0_4_ = fVar333 * fVar333 + fVar326 * fVar326 + fVar311 * fVar311;
    auVar203._4_4_ = fVar206 * fVar206 + fVar335 * fVar335 + fVar152 * fVar152;
    auVar203._8_4_ = fVar231 * fVar231 + fVar227 * fVar227 + fVar229 * fVar229;
    auVar203._12_4_ = fVar253 * fVar253 + fVar251 * fVar251 + fVar252 * fVar252;
    auVar203._16_4_ = fVar309 * fVar309 + fVar256 * fVar256 + fVar299 * fVar299;
    auVar203._20_4_ = fVar322 * fVar322 + fVar317 * fVar317 + fVar319 * fVar319;
    auVar203._24_4_ = fVar368 * fVar368 + fVar358 * fVar358 + fVar365 * fVar365;
    auVar203._28_4_ = fVar298 + fVar298 + auVar27._28_4_;
    auVar106 = vrcpps_avx(auVar203);
    fVar312 = auVar106._0_4_;
    fVar315 = auVar106._4_4_;
    auVar33._4_4_ = fVar315 * auVar203._4_4_;
    auVar33._0_4_ = fVar312 * auVar203._0_4_;
    fVar340 = auVar106._8_4_;
    auVar33._8_4_ = fVar340 * auVar203._8_4_;
    fVar357 = auVar106._12_4_;
    auVar33._12_4_ = fVar357 * auVar203._12_4_;
    fVar292 = auVar106._16_4_;
    auVar33._16_4_ = fVar292 * auVar203._16_4_;
    fVar321 = auVar106._20_4_;
    auVar33._20_4_ = fVar321 * auVar203._20_4_;
    fVar324 = auVar106._24_4_;
    auVar33._24_4_ = fVar324 * auVar203._24_4_;
    auVar33._28_4_ = fVar371;
    auVar170._8_4_ = 0x3f800000;
    auVar170._0_8_ = 0x3f8000003f800000;
    auVar170._12_4_ = 0x3f800000;
    auVar170._16_4_ = 0x3f800000;
    auVar170._20_4_ = 0x3f800000;
    auVar170._24_4_ = 0x3f800000;
    auVar170._28_4_ = 0x3f800000;
    auVar29 = vsubps_avx(auVar170,auVar33);
    fVar312 = fVar312 + fVar312 * auVar29._0_4_;
    fVar315 = fVar315 + fVar315 * auVar29._4_4_;
    fVar340 = fVar340 + fVar340 * auVar29._8_4_;
    fVar357 = fVar357 + fVar357 * auVar29._12_4_;
    fVar292 = fVar292 + fVar292 * auVar29._16_4_;
    fVar321 = fVar321 + fVar321 * auVar29._20_4_;
    fVar324 = fVar324 + fVar324 * auVar29._24_4_;
    auVar25 = vperm2f128_avx(auVar306,auVar306,1);
    auVar25 = vshufps_avx(auVar25,auVar306,0x30);
    auVar25 = vshufps_avx(auVar306,auVar25,0x29);
    auVar26 = vperm2f128_avx(auVar31,auVar31,1);
    auVar26 = vshufps_avx(auVar26,auVar31,0x30);
    local_9e0 = vshufps_avx(auVar31,auVar26,0x29);
    fVar360 = local_9e0._0_4_;
    fVar367 = local_9e0._4_4_;
    auVar34._4_4_ = fVar367 * fVar335;
    auVar34._0_4_ = fVar360 * fVar326;
    fVar370 = local_9e0._8_4_;
    auVar34._8_4_ = fVar370 * fVar227;
    fVar373 = local_9e0._12_4_;
    auVar34._12_4_ = fVar373 * fVar251;
    fVar376 = local_9e0._16_4_;
    auVar34._16_4_ = fVar376 * fVar256;
    fVar379 = local_9e0._20_4_;
    auVar34._20_4_ = fVar379 * fVar317;
    fVar382 = local_9e0._24_4_;
    auVar34._24_4_ = fVar382 * fVar358;
    auVar34._28_4_ = auVar26._28_4_;
    fVar380 = auVar25._0_4_;
    fVar179 = auVar25._4_4_;
    auVar35._4_4_ = fVar179 * fVar152;
    auVar35._0_4_ = fVar380 * fVar311;
    fVar384 = auVar25._8_4_;
    auVar35._8_4_ = fVar384 * fVar229;
    fVar182 = auVar25._12_4_;
    auVar35._12_4_ = fVar182 * fVar252;
    fVar388 = auVar25._16_4_;
    auVar35._16_4_ = fVar388 * fVar299;
    fVar185 = auVar25._20_4_;
    auVar35._20_4_ = fVar185 * fVar319;
    fVar389 = auVar25._24_4_;
    auVar35._24_4_ = fVar389 * fVar365;
    auVar35._28_4_ = fStack_1e4;
    auVar306 = vsubps_avx(auVar35,auVar34);
    auVar25 = vperm2f128_avx(auVar30,auVar30,1);
    auVar25 = vshufps_avx(auVar25,auVar30,0x30);
    auVar26 = vshufps_avx(auVar30,auVar25,0x29);
    fVar272 = auVar26._0_4_;
    fVar392 = auVar26._4_4_;
    auVar36._4_4_ = fVar392 * fVar152;
    auVar36._0_4_ = fVar272 * fVar311;
    fVar282 = auVar26._8_4_;
    auVar36._8_4_ = fVar282 * fVar229;
    fVar285 = auVar26._12_4_;
    auVar36._12_4_ = fVar285 * fVar252;
    fVar287 = auVar26._16_4_;
    auVar36._16_4_ = fVar287 * fVar299;
    fVar289 = auVar26._20_4_;
    auVar36._20_4_ = fVar289 * fVar319;
    fVar291 = auVar26._24_4_;
    auVar36._24_4_ = fVar291 * fVar365;
    auVar36._28_4_ = auVar25._28_4_;
    auVar37._4_4_ = fVar367 * fVar206;
    auVar37._0_4_ = fVar360 * fVar333;
    auVar37._8_4_ = fVar370 * fVar231;
    auVar37._12_4_ = fVar373 * fVar253;
    auVar37._16_4_ = fVar376 * fVar309;
    auVar37._20_4_ = fVar379 * fVar322;
    uVar90 = local_9e0._28_4_;
    auVar37._24_4_ = fVar382 * fVar368;
    auVar37._28_4_ = uVar90;
    auVar25 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar206 * fVar179;
    auVar38._0_4_ = fVar333 * fVar380;
    auVar38._8_4_ = fVar231 * fVar384;
    auVar38._12_4_ = fVar253 * fVar182;
    auVar38._16_4_ = fVar309 * fVar388;
    auVar38._20_4_ = fVar322 * fVar185;
    auVar38._24_4_ = fVar368 * fVar389;
    auVar38._28_4_ = uVar90;
    auVar39._4_4_ = fVar335 * fVar392;
    auVar39._0_4_ = fVar326 * fVar272;
    auVar39._8_4_ = fVar227 * fVar282;
    auVar39._12_4_ = fVar251 * fVar285;
    auVar39._16_4_ = fVar256 * fVar287;
    auVar39._20_4_ = fVar317 * fVar289;
    auVar39._24_4_ = fVar358 * fVar291;
    auVar39._28_4_ = fStack_1c4;
    auVar30 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ =
         fVar315 * (auVar27._4_4_ * auVar27._4_4_ +
                   auVar28._4_4_ * auVar28._4_4_ + auVar305._4_4_ * auVar305._4_4_);
    auVar40._0_4_ =
         fVar312 * (auVar27._0_4_ * auVar27._0_4_ +
                   auVar28._0_4_ * auVar28._0_4_ + auVar305._0_4_ * auVar305._0_4_);
    auVar40._8_4_ =
         fVar340 * (auVar27._8_4_ * auVar27._8_4_ +
                   auVar28._8_4_ * auVar28._8_4_ + auVar305._8_4_ * auVar305._8_4_);
    auVar40._12_4_ =
         fVar357 * (auVar27._12_4_ * auVar27._12_4_ +
                   auVar28._12_4_ * auVar28._12_4_ + auVar305._12_4_ * auVar305._12_4_);
    auVar40._16_4_ =
         fVar292 * (auVar27._16_4_ * auVar27._16_4_ +
                   auVar28._16_4_ * auVar28._16_4_ + auVar305._16_4_ * auVar305._16_4_);
    auVar40._20_4_ =
         fVar321 * (auVar27._20_4_ * auVar27._20_4_ +
                   auVar28._20_4_ * auVar28._20_4_ + auVar305._20_4_ * auVar305._20_4_);
    auVar40._24_4_ =
         fVar324 * (auVar27._24_4_ * auVar27._24_4_ +
                   auVar28._24_4_ * auVar28._24_4_ + auVar305._24_4_ * auVar305._24_4_);
    auVar40._28_4_ = auVar27._28_4_ + fVar298 + auVar305._28_4_;
    auVar41._4_4_ =
         (auVar306._4_4_ * auVar306._4_4_ +
         auVar25._4_4_ * auVar25._4_4_ + auVar30._4_4_ * auVar30._4_4_) * fVar315;
    auVar41._0_4_ =
         (auVar306._0_4_ * auVar306._0_4_ +
         auVar25._0_4_ * auVar25._0_4_ + auVar30._0_4_ * auVar30._0_4_) * fVar312;
    auVar41._8_4_ =
         (auVar306._8_4_ * auVar306._8_4_ +
         auVar25._8_4_ * auVar25._8_4_ + auVar30._8_4_ * auVar30._8_4_) * fVar340;
    auVar41._12_4_ =
         (auVar306._12_4_ * auVar306._12_4_ +
         auVar25._12_4_ * auVar25._12_4_ + auVar30._12_4_ * auVar30._12_4_) * fVar357;
    auVar41._16_4_ =
         (auVar306._16_4_ * auVar306._16_4_ +
         auVar25._16_4_ * auVar25._16_4_ + auVar30._16_4_ * auVar30._16_4_) * fVar292;
    auVar41._20_4_ =
         (auVar306._20_4_ * auVar306._20_4_ +
         auVar25._20_4_ * auVar25._20_4_ + auVar30._20_4_ * auVar30._20_4_) * fVar321;
    auVar41._24_4_ =
         (auVar306._24_4_ * auVar306._24_4_ +
         auVar25._24_4_ * auVar25._24_4_ + auVar30._24_4_ * auVar30._24_4_) * fVar324;
    auVar41._28_4_ = auVar106._28_4_ + auVar29._28_4_;
    auVar106 = vmaxps_avx(auVar40,auVar41);
    auVar25 = vperm2f128_avx(auVar244,auVar244,1);
    auVar25 = vshufps_avx(auVar25,auVar244,0x30);
    auVar27 = vshufps_avx(auVar244,auVar25,0x29);
    auVar131._0_4_ = auVar244._0_4_ + fVar283;
    auVar131._4_4_ = auVar244._4_4_ + fVar314;
    auVar131._8_4_ = auVar244._8_4_ + fVar223;
    auVar131._12_4_ = auVar244._12_4_ + fVar225;
    auVar131._16_4_ = auVar244._16_4_ + fVar233;
    auVar131._20_4_ = auVar244._20_4_ + fVar234;
    auVar131._24_4_ = auVar244._24_4_ + fVar254;
    auVar131._28_4_ = auVar244._28_4_ + fVar255;
    auVar25 = vmaxps_avx(auVar244,auVar131);
    auVar26 = vmaxps_avx(auVar23,auVar27);
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar26 = vrsqrtps_avx(auVar203);
    fVar298 = auVar26._0_4_;
    fVar283 = auVar26._4_4_;
    fVar314 = auVar26._8_4_;
    fVar223 = auVar26._12_4_;
    fVar225 = auVar26._16_4_;
    fVar233 = auVar26._20_4_;
    fVar234 = auVar26._24_4_;
    auVar42._4_4_ = fVar283 * fVar283 * fVar283 * auVar203._4_4_ * 0.5;
    auVar42._0_4_ = fVar298 * fVar298 * fVar298 * auVar203._0_4_ * 0.5;
    auVar42._8_4_ = fVar314 * fVar314 * fVar314 * auVar203._8_4_ * 0.5;
    auVar42._12_4_ = fVar223 * fVar223 * fVar223 * auVar203._12_4_ * 0.5;
    auVar42._16_4_ = fVar225 * fVar225 * fVar225 * auVar203._16_4_ * 0.5;
    auVar42._20_4_ = fVar233 * fVar233 * fVar233 * auVar203._20_4_ * 0.5;
    auVar42._24_4_ = fVar234 * fVar234 * fVar234 * auVar203._24_4_ * 0.5;
    auVar42._28_4_ = auVar203._28_4_;
    auVar43._4_4_ = fVar283 * 1.5;
    auVar43._0_4_ = fVar298 * 1.5;
    auVar43._8_4_ = fVar314 * 1.5;
    auVar43._12_4_ = fVar223 * 1.5;
    auVar43._16_4_ = fVar225 * 1.5;
    auVar43._20_4_ = fVar233 * 1.5;
    auVar43._24_4_ = fVar234 * 1.5;
    auVar43._28_4_ = auVar26._28_4_;
    _local_a40 = vsubps_avx(auVar43,auVar42);
    auVar80._4_4_ = fVar310;
    auVar80._0_4_ = fVar300;
    auVar80._8_4_ = fVar313;
    auVar80._12_4_ = fVar316;
    auVar80._16_4_ = fVar318;
    auVar80._20_4_ = fVar320;
    auVar80._24_4_ = fVar323;
    auVar80._28_4_ = fVar325;
    auVar305 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a20 = vsubps_avx(auVar305,auVar80);
    auVar78._4_4_ = fVar178;
    auVar78._0_4_ = fVar153;
    auVar78._8_4_ = fVar180;
    auVar78._12_4_ = fVar181;
    auVar78._16_4_ = fVar183;
    auVar78._20_4_ = fVar184;
    auVar78._24_4_ = fVar186;
    auVar78._28_4_ = fVar187;
    local_a00 = vsubps_avx(auVar305,auVar78);
    fVar327 = local_a00._0_4_;
    fVar332 = local_a00._4_4_;
    fVar334 = local_a00._8_4_;
    fVar336 = local_a00._12_4_;
    fVar337 = local_a00._16_4_;
    fVar338 = local_a00._20_4_;
    fVar339 = local_a00._24_4_;
    fVar283 = local_a20._0_4_;
    fVar223 = local_a20._4_4_;
    fVar233 = local_a20._8_4_;
    fVar254 = local_a20._12_4_;
    fVar312 = local_a20._16_4_;
    fVar340 = local_a20._20_4_;
    fVar292 = local_a20._24_4_;
    auVar305 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar81);
    fVar396 = auVar305._0_4_;
    fVar399 = auVar305._4_4_;
    fVar400 = auVar305._8_4_;
    fVar401 = auVar305._12_4_;
    fVar402 = auVar305._16_4_;
    fVar403 = auVar305._20_4_;
    fVar404 = auVar305._24_4_;
    auVar303._0_4_ =
         fVar396 * (float)local_880._0_4_ +
         (float)local_8a0._0_4_ * fVar283 + fVar327 * (float)local_8c0._0_4_;
    auVar303._4_4_ =
         fVar399 * (float)local_880._4_4_ +
         (float)local_8a0._4_4_ * fVar223 + fVar332 * (float)local_8c0._4_4_;
    auVar303._8_4_ = fVar400 * fStack_878 + fStack_898 * fVar233 + fVar334 * fStack_8b8;
    auVar303._12_4_ = fVar401 * fStack_874 + fStack_894 * fVar254 + fVar336 * fStack_8b4;
    auVar303._16_4_ = fVar402 * fStack_870 + fStack_890 * fVar312 + fVar337 * fStack_8b0;
    auVar303._20_4_ = fVar403 * fStack_86c + fStack_88c * fVar340 + fVar338 * fStack_8ac;
    auVar303._24_4_ = fVar404 * fStack_868 + fStack_888 * fVar292 + fVar339 * fStack_8a8;
    auVar303._28_4_ = auVar30._28_4_ + auVar26._28_4_ + auVar203._28_4_;
    auVar363._0_4_ = fVar396 * fVar396 + fVar283 * fVar283 + fVar327 * fVar327;
    auVar363._4_4_ = fVar399 * fVar399 + fVar223 * fVar223 + fVar332 * fVar332;
    auVar363._8_4_ = fVar400 * fVar400 + fVar233 * fVar233 + fVar334 * fVar334;
    auVar363._12_4_ = fVar401 * fVar401 + fVar254 * fVar254 + fVar336 * fVar336;
    auVar363._16_4_ = fVar402 * fVar402 + fVar312 * fVar312 + fVar337 * fVar337;
    auVar363._20_4_ = fVar403 * fVar403 + fVar340 * fVar340 + fVar338 * fVar338;
    auVar363._24_4_ = fVar404 * fVar404 + fVar292 * fVar292 + fVar339 * fVar339;
    auVar363._28_4_ = fStack_1c4 + fStack_1c4 + auVar30._28_4_;
    fVar314 = local_a40._0_4_;
    fVar225 = local_a40._4_4_;
    fVar234 = local_a40._8_4_;
    fVar255 = local_a40._12_4_;
    fVar315 = local_a40._16_4_;
    fVar357 = local_a40._20_4_;
    fVar321 = local_a40._24_4_;
    local_680._0_4_ =
         (float)local_880._0_4_ * fVar333 * fVar314 +
         fVar326 * fVar314 * (float)local_8a0._0_4_ + fVar311 * fVar314 * (float)local_8c0._0_4_;
    local_680._4_4_ =
         (float)local_880._4_4_ * fVar206 * fVar225 +
         fVar335 * fVar225 * (float)local_8a0._4_4_ + fVar152 * fVar225 * (float)local_8c0._4_4_;
    local_680._8_4_ =
         fStack_878 * fVar231 * fVar234 +
         fVar227 * fVar234 * fStack_898 + fVar229 * fVar234 * fStack_8b8;
    local_680._12_4_ =
         fStack_874 * fVar253 * fVar255 +
         fVar251 * fVar255 * fStack_894 + fVar252 * fVar255 * fStack_8b4;
    local_680._16_4_ =
         fStack_870 * fVar309 * fVar315 +
         fVar256 * fVar315 * fStack_890 + fVar299 * fVar315 * fStack_8b0;
    local_680._20_4_ =
         fStack_86c * fVar322 * fVar357 +
         fVar317 * fVar357 * fStack_88c + fVar319 * fVar357 * fStack_8ac;
    local_680._24_4_ =
         fStack_868 * fVar368 * fVar321 +
         fVar358 * fVar321 * fStack_888 + fVar365 * fVar321 * fStack_8a8;
    local_680._28_4_ = fStack_864 + fStack_884 + fStack_8a4;
    fVar298 = fStack_864 + fStack_884 + fStack_8a4;
    local_6a0._0_4_ =
         fVar396 * fVar333 * fVar314 + fVar326 * fVar314 * fVar283 + fVar327 * fVar311 * fVar314;
    local_6a0._4_4_ =
         fVar399 * fVar206 * fVar225 + fVar335 * fVar225 * fVar223 + fVar332 * fVar152 * fVar225;
    local_6a0._8_4_ =
         fVar400 * fVar231 * fVar234 + fVar227 * fVar234 * fVar233 + fVar334 * fVar229 * fVar234;
    local_6a0._12_4_ =
         fVar401 * fVar253 * fVar255 + fVar251 * fVar255 * fVar254 + fVar336 * fVar252 * fVar255;
    local_6a0._16_4_ =
         fVar402 * fVar309 * fVar315 + fVar256 * fVar315 * fVar312 + fVar337 * fVar299 * fVar315;
    local_6a0._20_4_ =
         fVar403 * fVar322 * fVar357 + fVar317 * fVar357 * fVar340 + fVar338 * fVar319 * fVar357;
    local_6a0._24_4_ =
         fVar404 * fVar368 * fVar321 + fVar358 * fVar321 * fVar292 + fVar339 * fVar365 * fVar321;
    local_6a0._28_4_ = fStack_884 + fVar298;
    auVar44._4_4_ = local_680._4_4_ * local_6a0._4_4_;
    auVar44._0_4_ = local_680._0_4_ * local_6a0._0_4_;
    auVar44._8_4_ = local_680._8_4_ * local_6a0._8_4_;
    auVar44._12_4_ = local_680._12_4_ * local_6a0._12_4_;
    auVar44._16_4_ = local_680._16_4_ * local_6a0._16_4_;
    auVar44._20_4_ = local_680._20_4_ * local_6a0._20_4_;
    auVar44._24_4_ = local_680._24_4_ * local_6a0._24_4_;
    auVar44._28_4_ = fVar298;
    auVar305 = vsubps_avx(auVar303,auVar44);
    auVar45._4_4_ = local_6a0._4_4_ * local_6a0._4_4_;
    auVar45._0_4_ = local_6a0._0_4_ * local_6a0._0_4_;
    auVar45._8_4_ = local_6a0._8_4_ * local_6a0._8_4_;
    auVar45._12_4_ = local_6a0._12_4_ * local_6a0._12_4_;
    auVar45._16_4_ = local_6a0._16_4_ * local_6a0._16_4_;
    auVar45._20_4_ = local_6a0._20_4_ * local_6a0._20_4_;
    auVar45._24_4_ = local_6a0._24_4_ * local_6a0._24_4_;
    auVar45._28_4_ = fStack_884;
    auVar28 = vsubps_avx(auVar363,auVar45);
    auVar26 = vsqrtps_avx(auVar106);
    fVar298 = (auVar26._0_4_ + auVar25._0_4_) * 1.0000002;
    fVar324 = (auVar26._4_4_ + auVar25._4_4_) * 1.0000002;
    fVar371 = (auVar26._8_4_ + auVar25._8_4_) * 1.0000002;
    fVar146 = (auVar26._12_4_ + auVar25._12_4_) * 1.0000002;
    fVar148 = (auVar26._16_4_ + auVar25._16_4_) * 1.0000002;
    fVar374 = (auVar26._20_4_ + auVar25._20_4_) * 1.0000002;
    fVar377 = (auVar26._24_4_ + auVar25._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar324 * fVar324;
    auVar46._0_4_ = fVar298 * fVar298;
    auVar46._8_4_ = fVar371 * fVar371;
    auVar46._12_4_ = fVar146 * fVar146;
    auVar46._16_4_ = fVar148 * fVar148;
    auVar46._20_4_ = fVar374 * fVar374;
    auVar46._24_4_ = fVar377 * fVar377;
    auVar46._28_4_ = auVar26._28_4_ + auVar25._28_4_;
    local_3c0._0_4_ = auVar305._0_4_ + auVar305._0_4_;
    local_3c0._4_4_ = auVar305._4_4_ + auVar305._4_4_;
    local_3c0._8_4_ = auVar305._8_4_ + auVar305._8_4_;
    local_3c0._12_4_ = auVar305._12_4_ + auVar305._12_4_;
    local_3c0._16_4_ = auVar305._16_4_ + auVar305._16_4_;
    local_3c0._20_4_ = auVar305._20_4_ + auVar305._20_4_;
    local_3c0._24_4_ = auVar305._24_4_ + auVar305._24_4_;
    fVar298 = auVar305._28_4_;
    local_3c0._28_4_ = fVar298 + fVar298;
    auVar25 = vsubps_avx(auVar28,auVar46);
    auVar47._4_4_ = local_680._4_4_ * local_680._4_4_;
    auVar47._0_4_ = local_680._0_4_ * local_680._0_4_;
    auVar47._8_4_ = local_680._8_4_ * local_680._8_4_;
    auVar47._12_4_ = local_680._12_4_ * local_680._12_4_;
    auVar47._16_4_ = local_680._16_4_ * local_680._16_4_;
    auVar47._20_4_ = local_680._20_4_ * local_680._20_4_;
    auVar47._24_4_ = local_680._24_4_ * local_680._24_4_;
    auVar47._28_4_ = fVar298;
    auVar305 = vsubps_avx(local_260,auVar47);
    auVar48._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
    auVar48._0_4_ = local_3c0._0_4_ * local_3c0._0_4_;
    auVar48._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    auVar48._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    auVar48._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    auVar48._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    auVar48._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    auVar48._28_4_ = local_260._28_4_;
    fVar298 = auVar305._0_4_;
    fVar324 = auVar305._4_4_;
    fVar371 = auVar305._8_4_;
    fVar146 = auVar305._12_4_;
    fVar148 = auVar305._16_4_;
    fVar374 = auVar305._20_4_;
    fVar377 = auVar305._24_4_;
    auVar49._4_4_ = auVar25._4_4_ * fVar324 * 4.0;
    auVar49._0_4_ = auVar25._0_4_ * fVar298 * 4.0;
    auVar49._8_4_ = auVar25._8_4_ * fVar371 * 4.0;
    auVar49._12_4_ = auVar25._12_4_ * fVar146 * 4.0;
    auVar49._16_4_ = auVar25._16_4_ * fVar148 * 4.0;
    auVar49._20_4_ = auVar25._20_4_ * fVar374 * 4.0;
    auVar49._24_4_ = auVar25._24_4_ * fVar377 * 4.0;
    auVar49._28_4_ = 0x40800000;
    auVar29 = vsubps_avx(auVar48,auVar49);
    auVar106 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
    auVar222 = ZEXT3264(auVar106);
    auVar276._8_4_ = 0x7fffffff;
    auVar276._0_8_ = 0x7fffffff7fffffff;
    auVar276._12_4_ = 0x7fffffff;
    auVar276._16_4_ = 0x7fffffff;
    auVar276._20_4_ = 0x7fffffff;
    auVar276._24_4_ = 0x7fffffff;
    auVar276._28_4_ = 0x7fffffff;
    local_3a0 = vandps_avx(auVar47,auVar276);
    local_300._0_4_ = fVar298 + fVar298;
    local_300._4_4_ = fVar324 + fVar324;
    local_300._8_4_ = fVar371 + fVar371;
    local_300._12_4_ = fVar146 + fVar146;
    local_300._16_4_ = fVar148 + fVar148;
    local_300._20_4_ = fVar374 + fVar374;
    local_300._24_4_ = fVar377 + fVar377;
    local_300._28_4_ = auVar305._28_4_ + auVar305._28_4_;
    local_2c0 = vandps_avx(auVar305,auVar276);
    uVar86 = CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_2e0._0_8_ = uVar86 ^ 0x8000000080000000;
    local_2e0._8_4_ = -local_3c0._8_4_;
    local_2e0._12_4_ = -local_3c0._12_4_;
    local_2e0._16_4_ = -local_3c0._16_4_;
    local_2e0._20_4_ = -local_3c0._20_4_;
    local_2e0._24_4_ = -local_3c0._24_4_;
    local_2e0._28_4_ = -local_3c0._28_4_;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
      auVar349 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar132._8_4_ = 0xff800000;
      auVar132._0_8_ = 0xff800000ff800000;
      auVar132._12_4_ = 0xff800000;
      auVar132._16_4_ = 0xff800000;
      auVar132._20_4_ = 0xff800000;
      auVar132._24_4_ = 0xff800000;
      auVar132._28_4_ = 0xff800000;
    }
    else {
      auVar306 = vsqrtps_avx(auVar29);
      auVar106 = vrcpps_avx(local_300);
      auVar305 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
      fVar118 = auVar106._0_4_;
      fVar144 = auVar106._4_4_;
      auVar50._4_4_ = local_300._4_4_ * fVar144;
      auVar50._0_4_ = local_300._0_4_ * fVar118;
      fVar145 = auVar106._8_4_;
      auVar50._8_4_ = local_300._8_4_ * fVar145;
      fVar147 = auVar106._12_4_;
      auVar50._12_4_ = local_300._12_4_ * fVar147;
      fVar149 = auVar106._16_4_;
      auVar50._16_4_ = local_300._16_4_ * fVar149;
      fVar150 = auVar106._20_4_;
      auVar50._20_4_ = local_300._20_4_ * fVar150;
      fVar151 = auVar106._24_4_;
      auVar50._24_4_ = local_300._24_4_ * fVar151;
      auVar50._28_4_ = auVar29._28_4_;
      auVar107._8_4_ = 0x3f800000;
      auVar107._0_8_ = 0x3f8000003f800000;
      auVar107._12_4_ = 0x3f800000;
      auVar107._16_4_ = 0x3f800000;
      auVar107._20_4_ = 0x3f800000;
      auVar107._24_4_ = 0x3f800000;
      auVar107._28_4_ = 0x3f800000;
      auVar29 = vsubps_avx(auVar107,auVar50);
      fVar118 = fVar118 + fVar118 * auVar29._0_4_;
      fVar144 = fVar144 + fVar144 * auVar29._4_4_;
      fVar145 = fVar145 + fVar145 * auVar29._8_4_;
      fVar147 = fVar147 + fVar147 * auVar29._12_4_;
      fVar149 = fVar149 + fVar149 * auVar29._16_4_;
      fVar150 = fVar150 + fVar150 * auVar29._20_4_;
      fVar151 = fVar151 + fVar151 * auVar29._24_4_;
      auVar30 = vsubps_avx(local_2e0,auVar306);
      fVar257 = auVar30._0_4_ * fVar118;
      fVar265 = auVar30._4_4_ * fVar144;
      auVar51._4_4_ = fVar265;
      auVar51._0_4_ = fVar257;
      fVar266 = auVar30._8_4_ * fVar145;
      auVar51._8_4_ = fVar266;
      fVar267 = auVar30._12_4_ * fVar147;
      auVar51._12_4_ = fVar267;
      fVar268 = auVar30._16_4_ * fVar149;
      auVar51._16_4_ = fVar268;
      fVar269 = auVar30._20_4_ * fVar150;
      auVar51._20_4_ = fVar269;
      fVar270 = auVar30._24_4_ * fVar151;
      auVar51._24_4_ = fVar270;
      auVar51._28_4_ = auVar30._28_4_;
      auVar306 = vsubps_avx(auVar306,local_3c0);
      fVar118 = auVar306._0_4_ * fVar118;
      fVar144 = auVar306._4_4_ * fVar144;
      auVar52._4_4_ = fVar144;
      auVar52._0_4_ = fVar118;
      fVar145 = auVar306._8_4_ * fVar145;
      auVar52._8_4_ = fVar145;
      fVar147 = auVar306._12_4_ * fVar147;
      auVar52._12_4_ = fVar147;
      fVar149 = auVar306._16_4_ * fVar149;
      auVar52._16_4_ = fVar149;
      fVar150 = auVar306._20_4_ * fVar150;
      auVar52._20_4_ = fVar150;
      fVar151 = auVar306._24_4_ * fVar151;
      auVar52._24_4_ = fVar151;
      auVar52._28_4_ = auVar106._28_4_ + auVar29._28_4_;
      fStack_364 = local_6a0._28_4_ + auVar306._28_4_;
      local_380 = fVar314 * (local_6a0._0_4_ + local_680._0_4_ * fVar257);
      fStack_37c = fVar225 * (local_6a0._4_4_ + local_680._4_4_ * fVar265);
      fStack_378 = fVar234 * (local_6a0._8_4_ + local_680._8_4_ * fVar266);
      fStack_374 = fVar255 * (local_6a0._12_4_ + local_680._12_4_ * fVar267);
      fStack_370 = fVar315 * (local_6a0._16_4_ + local_680._16_4_ * fVar268);
      fStack_36c = fVar357 * (local_6a0._20_4_ + local_680._20_4_ * fVar269);
      fStack_368 = fVar321 * (local_6a0._24_4_ + local_680._24_4_ * fVar270);
      local_360 = fVar314 * (local_6a0._0_4_ + local_680._0_4_ * fVar118);
      fStack_35c = fVar225 * (local_6a0._4_4_ + local_680._4_4_ * fVar144);
      fStack_358 = fVar234 * (local_6a0._8_4_ + local_680._8_4_ * fVar145);
      fStack_354 = fVar255 * (local_6a0._12_4_ + local_680._12_4_ * fVar147);
      fStack_350 = fVar315 * (local_6a0._16_4_ + local_680._16_4_ * fVar149);
      fStack_34c = fVar357 * (local_6a0._20_4_ + local_680._20_4_ * fVar150);
      fStack_348 = fVar321 * (local_6a0._24_4_ + local_680._24_4_ * fVar151);
      fStack_344 = local_6a0._28_4_ + fStack_364;
      auVar245._8_4_ = 0x7f800000;
      auVar245._0_8_ = 0x7f8000007f800000;
      auVar245._12_4_ = 0x7f800000;
      auVar245._16_4_ = 0x7f800000;
      auVar245._20_4_ = 0x7f800000;
      auVar245._24_4_ = 0x7f800000;
      auVar245._28_4_ = 0x7f800000;
      auVar106 = vblendvps_avx(auVar245,auVar51,auVar305);
      auVar349 = ZEXT3264(auVar106);
      auVar246._8_4_ = 0xff800000;
      auVar246._0_8_ = 0xff800000ff800000;
      auVar246._12_4_ = 0xff800000;
      auVar246._16_4_ = 0xff800000;
      auVar246._20_4_ = 0xff800000;
      auVar246._24_4_ = 0xff800000;
      auVar246._28_4_ = 0xff800000;
      auVar132 = vblendvps_avx(auVar246,auVar52,auVar305);
      auVar29 = vmaxps_avx(local_620,local_3a0);
      auVar53._4_4_ = auVar29._4_4_ * 1.9073486e-06;
      auVar53._0_4_ = auVar29._0_4_ * 1.9073486e-06;
      auVar53._8_4_ = auVar29._8_4_ * 1.9073486e-06;
      auVar53._12_4_ = auVar29._12_4_ * 1.9073486e-06;
      auVar53._16_4_ = auVar29._16_4_ * 1.9073486e-06;
      auVar53._20_4_ = auVar29._20_4_ * 1.9073486e-06;
      auVar53._24_4_ = auVar29._24_4_ * 1.9073486e-06;
      auVar53._28_4_ = auVar29._28_4_;
      auVar29 = vcmpps_avx(local_2c0,auVar53,1);
      auVar306 = auVar305 & auVar29;
      if ((((((((auVar306 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar306 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar306 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar306 >> 0x7f,0) != '\0') ||
            (auVar306 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar306 >> 0xbf,0) != '\0') ||
          (auVar306 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar306[0x1f] < '\0') {
        auVar29 = vandps_avx(auVar29,auVar305);
        auVar167 = vpackssdw_avx(auVar29._0_16_,auVar29._16_16_);
        auVar306 = vcmpps_avx(auVar25,_DAT_01f7b000,2);
        auVar278._8_4_ = 0xff800000;
        auVar278._0_8_ = 0xff800000ff800000;
        auVar278._12_4_ = 0xff800000;
        auVar278._16_4_ = 0xff800000;
        auVar278._20_4_ = 0xff800000;
        auVar278._24_4_ = 0xff800000;
        auVar278._28_4_ = 0xff800000;
        auVar279._8_4_ = 0x7f800000;
        auVar279._0_8_ = 0x7f8000007f800000;
        auVar279._12_4_ = 0x7f800000;
        auVar279._16_4_ = 0x7f800000;
        auVar279._20_4_ = 0x7f800000;
        auVar279._24_4_ = 0x7f800000;
        auVar279._28_4_ = 0x7f800000;
        auVar25 = vblendvps_avx(auVar279,auVar278,auVar306);
        auVar211 = vpmovsxwd_avx(auVar167);
        auVar167 = vpunpckhwd_avx(auVar167,auVar167);
        auVar250._16_16_ = auVar167;
        auVar250._0_16_ = auVar211;
        auVar106 = vblendvps_avx(auVar106,auVar25,auVar250);
        auVar25 = vblendvps_avx(auVar278,auVar279,auVar306);
        auVar349 = ZEXT3264(auVar106);
        auVar132 = vblendvps_avx(auVar132,auVar25,auVar250);
        auVar221._0_8_ = auVar29._0_8_ ^ 0xffffffffffffffff;
        auVar221._8_4_ = auVar29._8_4_ ^ 0xffffffff;
        auVar221._12_4_ = auVar29._12_4_ ^ 0xffffffff;
        auVar221._16_4_ = auVar29._16_4_ ^ 0xffffffff;
        auVar221._20_4_ = auVar29._20_4_ ^ 0xffffffff;
        auVar221._24_4_ = auVar29._24_4_ ^ 0xffffffff;
        auVar221._28_4_ = auVar29._28_4_ ^ 0xffffffff;
        auVar106 = vorps_avx(auVar306,auVar221);
        auVar106 = vandps_avx(auVar305,auVar106);
        auVar222 = ZEXT3264(auVar106);
      }
    }
    auVar297 = ZEXT3264(local_6a0);
    auVar304._8_4_ = 0x7fffffff;
    auVar304._0_8_ = 0x7fffffff7fffffff;
    auVar304._12_4_ = 0x7fffffff;
    auVar304._16_4_ = 0x7fffffff;
    auVar304._20_4_ = 0x7fffffff;
    auVar304._24_4_ = 0x7fffffff;
    auVar304._28_4_ = 0x7fffffff;
    auVar307 = ZEXT3264(auVar304);
    auVar106 = local_5e0 & auVar222._0_32_;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0x7f,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar106 >> 0xbf,0) != '\0') ||
        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar106[0x1f] < '\0') {
      auVar108 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x100));
      local_3e0 = auVar108;
      auVar167 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_960._0_4_));
      auVar167 = vshufps_avx(auVar167,auVar167,0);
      auVar247._16_16_ = auVar167;
      auVar247._0_16_ = auVar167;
      auVar29 = vminps_avx(auVar247,auVar132);
      auVar109._0_4_ =
           fVar390 * (float)local_880._0_4_ +
           (float)local_8a0._0_4_ * fVar341 + (float)local_8c0._0_4_ * fVar359;
      auVar109._4_4_ =
           fVar391 * (float)local_880._4_4_ +
           (float)local_8a0._4_4_ * fVar350 + (float)local_8c0._4_4_ * fVar366;
      auVar109._8_4_ = fVar393 * fStack_878 + fStack_898 * fVar351 + fStack_8b8 * fVar369;
      auVar109._12_4_ = fVar284 * fStack_874 + fStack_894 * fVar353 + fStack_8b4 * fVar372;
      auVar109._16_4_ = fVar286 * fStack_870 + fStack_890 * fVar354 + fStack_8b0 * fVar375;
      auVar109._20_4_ = fVar288 * fStack_86c + fStack_88c * fVar355 + fStack_8ac * fVar378;
      auVar109._24_4_ = fVar290 * fStack_868 + fStack_888 * fVar356 + fStack_8a8 * fVar381;
      auVar109._28_4_ = fVar383 + fStack_1e4 + fVar383;
      auVar305 = vrcpps_avx(auVar109);
      fVar383 = auVar305._0_4_;
      fVar118 = auVar305._4_4_;
      auVar54._4_4_ = auVar109._4_4_ * fVar118;
      auVar54._0_4_ = auVar109._0_4_ * fVar383;
      fVar144 = auVar305._8_4_;
      auVar54._8_4_ = auVar109._8_4_ * fVar144;
      fVar145 = auVar305._12_4_;
      auVar54._12_4_ = auVar109._12_4_ * fVar145;
      fVar147 = auVar305._16_4_;
      auVar54._16_4_ = auVar109._16_4_ * fVar147;
      fVar149 = auVar305._20_4_;
      auVar54._20_4_ = auVar109._20_4_ * fVar149;
      fVar150 = auVar305._24_4_;
      auVar54._24_4_ = auVar109._24_4_ * fVar150;
      auVar54._28_4_ = fVar281 + auVar167._12_4_;
      auVar294._8_4_ = 0x3f800000;
      auVar294._0_8_ = 0x3f8000003f800000;
      auVar294._12_4_ = 0x3f800000;
      auVar294._16_4_ = 0x3f800000;
      auVar294._20_4_ = 0x3f800000;
      auVar294._24_4_ = 0x3f800000;
      auVar294._28_4_ = 0x3f800000;
      auVar306 = vsubps_avx(auVar294,auVar54);
      auVar106 = vandps_avx(auVar304,auVar109);
      auVar297 = ZEXT3264(auVar304);
      auVar394._8_4_ = 0x219392ef;
      auVar394._0_8_ = 0x219392ef219392ef;
      auVar394._12_4_ = 0x219392ef;
      auVar394._16_4_ = 0x219392ef;
      auVar394._20_4_ = 0x219392ef;
      auVar394._24_4_ = 0x219392ef;
      auVar394._28_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar106,auVar394,1);
      auVar55._4_4_ =
           (fVar118 + fVar118 * auVar306._4_4_) *
           -(fVar391 * fVar399 + fVar350 * fVar223 + fVar366 * fVar332);
      auVar55._0_4_ =
           (fVar383 + fVar383 * auVar306._0_4_) *
           -(fVar390 * fVar396 + fVar341 * fVar283 + fVar359 * fVar327);
      auVar55._8_4_ =
           (fVar144 + fVar144 * auVar306._8_4_) *
           -(fVar393 * fVar400 + fVar351 * fVar233 + fVar369 * fVar334);
      auVar55._12_4_ =
           (fVar145 + fVar145 * auVar306._12_4_) *
           -(fVar284 * fVar401 + fVar353 * fVar254 + fVar372 * fVar336);
      auVar55._16_4_ =
           (fVar147 + fVar147 * auVar306._16_4_) *
           -(fVar286 * fVar402 + fVar354 * fVar312 + fVar375 * fVar337);
      auVar55._20_4_ =
           (fVar149 + fVar149 * auVar306._20_4_) *
           -(fVar288 * fVar403 + fVar355 * fVar340 + fVar378 * fVar338);
      auVar55._24_4_ =
           (fVar150 + fVar150 * auVar306._24_4_) *
           -(fVar290 * fVar404 + fVar356 * fVar292 + fVar381 * fVar339);
      auVar55._28_4_ = auVar305._28_4_ + auVar306._28_4_;
      auVar305 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar106 = vcmpps_avx(auVar109,auVar305,1);
      auVar106 = vorps_avx(auVar25,auVar106);
      auVar364._8_4_ = 0xff800000;
      auVar364._0_8_ = 0xff800000ff800000;
      auVar364._12_4_ = 0xff800000;
      auVar364._16_4_ = 0xff800000;
      auVar364._20_4_ = 0xff800000;
      auVar364._24_4_ = 0xff800000;
      auVar364._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar55,auVar364,auVar106);
      auVar305 = vcmpps_avx(auVar109,auVar305,6);
      auVar25 = vorps_avx(auVar25,auVar305);
      auVar387._8_4_ = 0x7f800000;
      auVar387._0_8_ = 0x7f8000007f800000;
      auVar387._12_4_ = 0x7f800000;
      auVar387._16_4_ = 0x7f800000;
      auVar387._20_4_ = 0x7f800000;
      auVar387._24_4_ = 0x7f800000;
      auVar387._28_4_ = 0x7f800000;
      auVar25 = vblendvps_avx(auVar55,auVar387,auVar25);
      auVar305 = vmaxps_avx(local_340,auVar349._0_32_);
      auVar305 = vmaxps_avx(auVar305,auVar106);
      auVar29 = vminps_avx(auVar29,auVar25);
      auVar349 = ZEXT3264(auVar29);
      auVar306 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar106 = vsubps_avx(auVar306,auVar22);
      auVar25 = vsubps_avx(auVar306,auVar202);
      auVar56._4_4_ = auVar25._4_4_ * -fVar367;
      auVar56._0_4_ = auVar25._0_4_ * -fVar360;
      auVar56._8_4_ = auVar25._8_4_ * -fVar370;
      auVar56._12_4_ = auVar25._12_4_ * -fVar373;
      auVar56._16_4_ = auVar25._16_4_ * -fVar376;
      auVar56._20_4_ = auVar25._20_4_ * -fVar379;
      auVar56._24_4_ = auVar25._24_4_ * -fVar382;
      auVar56._28_4_ = auVar25._28_4_;
      auVar57._4_4_ = fVar179 * auVar106._4_4_;
      auVar57._0_4_ = fVar380 * auVar106._0_4_;
      auVar57._8_4_ = fVar384 * auVar106._8_4_;
      auVar57._12_4_ = fVar182 * auVar106._12_4_;
      auVar57._16_4_ = fVar388 * auVar106._16_4_;
      auVar57._20_4_ = fVar185 * auVar106._20_4_;
      auVar57._24_4_ = fVar389 * auVar106._24_4_;
      auVar57._28_4_ = auVar106._28_4_;
      auVar106 = vsubps_avx(auVar56,auVar57);
      auVar25 = vsubps_avx(auVar306,auVar24);
      auVar58._4_4_ = fVar392 * auVar25._4_4_;
      auVar58._0_4_ = fVar272 * auVar25._0_4_;
      auVar58._8_4_ = fVar282 * auVar25._8_4_;
      auVar58._12_4_ = fVar285 * auVar25._12_4_;
      auVar58._16_4_ = fVar287 * auVar25._16_4_;
      auVar58._20_4_ = fVar289 * auVar25._20_4_;
      uVar7 = auVar25._28_4_;
      auVar58._24_4_ = fVar291 * auVar25._24_4_;
      auVar58._28_4_ = uVar7;
      auVar22 = vsubps_avx(auVar106,auVar58);
      auVar59._4_4_ = (float)local_8c0._4_4_ * -fVar367;
      auVar59._0_4_ = (float)local_8c0._0_4_ * -fVar360;
      auVar59._8_4_ = fStack_8b8 * -fVar370;
      auVar59._12_4_ = fStack_8b4 * -fVar373;
      auVar59._16_4_ = fStack_8b0 * -fVar376;
      auVar59._20_4_ = fStack_8ac * -fVar379;
      auVar59._24_4_ = fStack_8a8 * -fVar382;
      auVar59._28_4_ = uVar90 ^ 0x80000000;
      auVar398._8_4_ = 0x3f800000;
      auVar398._0_8_ = 0x3f8000003f800000;
      auVar398._12_4_ = 0x3f800000;
      auVar398._16_4_ = 0x3f800000;
      auVar398._20_4_ = 0x3f800000;
      auVar398._24_4_ = 0x3f800000;
      auVar398._28_4_ = 0x3f800000;
      auVar60._4_4_ = fVar179 * (float)local_8a0._4_4_;
      auVar60._0_4_ = fVar380 * (float)local_8a0._0_4_;
      auVar60._8_4_ = fVar384 * fStack_898;
      auVar60._12_4_ = fVar182 * fStack_894;
      auVar60._16_4_ = fVar388 * fStack_890;
      auVar60._20_4_ = fVar185 * fStack_88c;
      auVar60._24_4_ = fVar389 * fStack_888;
      auVar60._28_4_ = uVar7;
      auVar106 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = (float)local_880._4_4_ * fVar392;
      auVar61._0_4_ = (float)local_880._0_4_ * fVar272;
      auVar61._8_4_ = fStack_878 * fVar282;
      auVar61._12_4_ = fStack_874 * fVar285;
      auVar61._16_4_ = fStack_870 * fVar287;
      auVar61._20_4_ = fStack_86c * fVar289;
      auVar61._24_4_ = fStack_868 * fVar291;
      auVar61._28_4_ = uVar7;
      auVar202 = vsubps_avx(auVar106,auVar61);
      auVar106 = vrcpps_avx(auVar202);
      fVar283 = auVar106._0_4_;
      fVar223 = auVar106._4_4_;
      auVar62._4_4_ = auVar202._4_4_ * fVar223;
      auVar62._0_4_ = auVar202._0_4_ * fVar283;
      fVar233 = auVar106._8_4_;
      auVar62._8_4_ = auVar202._8_4_ * fVar233;
      fVar254 = auVar106._12_4_;
      auVar62._12_4_ = auVar202._12_4_ * fVar254;
      fVar312 = auVar106._16_4_;
      auVar62._16_4_ = auVar202._16_4_ * fVar312;
      fVar340 = auVar106._20_4_;
      auVar62._20_4_ = auVar202._20_4_ * fVar340;
      fVar292 = auVar106._24_4_;
      auVar62._24_4_ = auVar202._24_4_ * fVar292;
      auVar62._28_4_ = fStack_884;
      auVar24 = vsubps_avx(auVar398,auVar62);
      auVar106 = vandps_avx(auVar304,auVar202);
      auVar110._8_4_ = 0x219392ef;
      auVar110._0_8_ = 0x219392ef219392ef;
      auVar110._12_4_ = 0x219392ef;
      auVar110._16_4_ = 0x219392ef;
      auVar110._20_4_ = 0x219392ef;
      auVar110._24_4_ = 0x219392ef;
      auVar110._28_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar106,auVar110,1);
      auVar63._4_4_ = (fVar223 + fVar223 * auVar24._4_4_) * -auVar22._4_4_;
      auVar63._0_4_ = (fVar283 + fVar283 * auVar24._0_4_) * -auVar22._0_4_;
      auVar63._8_4_ = (fVar233 + fVar233 * auVar24._8_4_) * -auVar22._8_4_;
      auVar63._12_4_ = (fVar254 + fVar254 * auVar24._12_4_) * -auVar22._12_4_;
      auVar63._16_4_ = (fVar312 + fVar312 * auVar24._16_4_) * -auVar22._16_4_;
      auVar63._20_4_ = (fVar340 + fVar340 * auVar24._20_4_) * -auVar22._20_4_;
      auVar63._24_4_ = (fVar292 + fVar292 * auVar24._24_4_) * -auVar22._24_4_;
      auVar63._28_4_ = auVar22._28_4_ ^ 0x80000000;
      auVar106 = vcmpps_avx(auVar202,ZEXT832(0) << 0x20,1);
      auVar106 = vorps_avx(auVar25,auVar106);
      auVar106 = vblendvps_avx(auVar63,auVar364,auVar106);
      local_8e0 = vmaxps_avx(auVar305,auVar106);
      auVar106 = vcmpps_avx(auVar202,ZEXT832(0) << 0x20,6);
      auVar106 = vorps_avx(auVar25,auVar106);
      auVar25 = vblendvps_avx(auVar63,auVar387,auVar106);
      auVar106 = vandps_avx(auVar222._0_32_,local_5e0);
      local_400 = vminps_avx(auVar29,auVar25);
      auVar25 = vcmpps_avx(local_8e0,local_400,2);
      auVar22 = auVar106 & auVar25;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0x7f,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0xbf,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f])
      {
        auVar307 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
      }
      else {
        auVar22 = vminps_avx(auVar244,auVar131);
        auVar202 = vminps_avx(auVar23,auVar27);
        auVar22 = vminps_avx(auVar22,auVar202);
        auVar22 = vsubps_avx(auVar22,auVar26);
        auVar106 = vandps_avx(auVar25,auVar106);
        auVar82._4_4_ = fStack_37c;
        auVar82._0_4_ = local_380;
        auVar82._8_4_ = fStack_378;
        auVar82._12_4_ = fStack_374;
        auVar82._16_4_ = fStack_370;
        auVar82._20_4_ = fStack_36c;
        auVar82._24_4_ = fStack_368;
        auVar82._28_4_ = fStack_364;
        auVar25 = vminps_avx(auVar82,auVar398);
        auVar222 = ZEXT864(0) << 0x20;
        auVar25 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar224 + fVar230 * (auVar25._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar226 + fVar232 * (auVar25._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar228 + fVar342 * (auVar25._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_a44 + fVar352 * (auVar25._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar224 + fVar230 * (auVar25._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar226 + fVar232 * (auVar25._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar228 + fVar342 * (auVar25._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_a44 + auVar25._28_4_ + 7.0;
        auVar83._4_4_ = fStack_35c;
        auVar83._0_4_ = local_360;
        auVar83._8_4_ = fStack_358;
        auVar83._12_4_ = fStack_354;
        auVar83._16_4_ = fStack_350;
        auVar83._20_4_ = fStack_34c;
        auVar83._24_4_ = fStack_348;
        auVar83._28_4_ = fStack_344;
        auVar25 = vminps_avx(auVar83,auVar398);
        auVar25 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar224 + fVar230 * (auVar25._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar226 + fVar232 * (auVar25._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar228 + fVar342 * (auVar25._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_a44 + fVar352 * (auVar25._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar224 + fVar230 * (auVar25._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar226 + fVar232 * (auVar25._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar228 + fVar342 * (auVar25._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_a44 + auVar25._28_4_ + 7.0;
        auVar64._4_4_ = auVar22._4_4_ * 0.99999976;
        auVar64._0_4_ = auVar22._0_4_ * 0.99999976;
        auVar64._8_4_ = auVar22._8_4_ * 0.99999976;
        auVar64._12_4_ = auVar22._12_4_ * 0.99999976;
        auVar64._16_4_ = auVar22._16_4_ * 0.99999976;
        auVar64._20_4_ = auVar22._20_4_ * 0.99999976;
        auVar64._24_4_ = auVar22._24_4_ * 0.99999976;
        auVar64._28_4_ = 0x3f7ffffc;
        auVar25 = vmaxps_avx(ZEXT832(0) << 0x20,auVar64);
        auVar65._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar65._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar65._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar65._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar65._16_4_ = auVar25._16_4_ * auVar25._16_4_;
        auVar65._20_4_ = auVar25._20_4_ * auVar25._20_4_;
        auVar65._24_4_ = auVar25._24_4_ * auVar25._24_4_;
        auVar65._28_4_ = auVar25._28_4_;
        auVar22 = vsubps_avx(auVar28,auVar65);
        auVar66._4_4_ = auVar22._4_4_ * fVar324 * 4.0;
        auVar66._0_4_ = auVar22._0_4_ * fVar298 * 4.0;
        auVar66._8_4_ = auVar22._8_4_ * fVar371 * 4.0;
        auVar66._12_4_ = auVar22._12_4_ * fVar146 * 4.0;
        auVar66._16_4_ = auVar22._16_4_ * fVar148 * 4.0;
        auVar66._20_4_ = auVar22._20_4_ * fVar374 * 4.0;
        auVar66._24_4_ = auVar22._24_4_ * fVar377 * 4.0;
        auVar66._28_4_ = auVar25._28_4_;
        auVar202 = vsubps_avx(auVar48,auVar66);
        local_980 = vcmpps_avx(auVar202,ZEXT832(0) << 0x20,5);
        auVar25 = local_980;
        if ((((((((local_980 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_980 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_980 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_980 >> 0x7f,0) == '\0') &&
              (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_980 >> 0xbf,0) == '\0') &&
            (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_980[0x1f]) {
          auVar275 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar262 = ZEXT828(0) << 0x20;
          auVar242 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_a60 = ZEXT432(0) << 0x20;
          _local_ba0 = local_a60._0_28_;
          auVar295._8_4_ = 0x7f800000;
          auVar295._0_8_ = 0x7f8000007f800000;
          auVar295._12_4_ = 0x7f800000;
          auVar295._16_4_ = 0x7f800000;
          auVar295._20_4_ = 0x7f800000;
          auVar295._24_4_ = 0x7f800000;
          auVar295._28_4_ = 0x7f800000;
          auVar347._8_4_ = 0xff800000;
          auVar347._0_8_ = 0xff800000ff800000;
          auVar347._12_4_ = 0xff800000;
          auVar347._16_4_ = 0xff800000;
          auVar347._20_4_ = 0xff800000;
          auVar347._24_4_ = 0xff800000;
          auVar347._28_4_ = 0xff800000;
          auVar17 = auVar22;
          local_980 = auVar31;
        }
        else {
          auVar23 = vrcpps_avx(local_300);
          fVar298 = auVar23._0_4_;
          auVar216._0_4_ = local_300._0_4_ * fVar298;
          fVar283 = auVar23._4_4_;
          auVar216._4_4_ = local_300._4_4_ * fVar283;
          fVar223 = auVar23._8_4_;
          auVar216._8_4_ = local_300._8_4_ * fVar223;
          fVar233 = auVar23._12_4_;
          auVar216._12_4_ = local_300._12_4_ * fVar233;
          fVar254 = auVar23._16_4_;
          auVar216._16_4_ = local_300._16_4_ * fVar254;
          fVar312 = auVar23._20_4_;
          auVar216._20_4_ = local_300._20_4_ * fVar312;
          fVar340 = auVar23._24_4_;
          auVar216._24_4_ = local_300._24_4_ * fVar340;
          auVar216._28_4_ = 0;
          auVar27 = vsubps_avx(auVar398,auVar216);
          auVar24 = vsqrtps_avx(auVar202);
          fVar298 = fVar298 + fVar298 * auVar27._0_4_;
          fVar283 = fVar283 + fVar283 * auVar27._4_4_;
          fVar223 = fVar223 + fVar223 * auVar27._8_4_;
          fVar233 = fVar233 + fVar233 * auVar27._12_4_;
          fVar254 = fVar254 + fVar254 * auVar27._16_4_;
          fVar312 = fVar312 + fVar312 * auVar27._20_4_;
          fVar340 = fVar340 + fVar340 * auVar27._24_4_;
          auVar305 = vsubps_avx(local_2e0,auVar24);
          fVar342 = auVar305._0_4_ * fVar298;
          fVar371 = auVar305._4_4_ * fVar283;
          auVar67._4_4_ = fVar371;
          auVar67._0_4_ = fVar342;
          fVar352 = auVar305._8_4_ * fVar223;
          auVar67._8_4_ = fVar352;
          fVar146 = auVar305._12_4_ * fVar233;
          auVar67._12_4_ = fVar146;
          fVar148 = auVar305._16_4_ * fVar254;
          auVar67._16_4_ = fVar148;
          fVar374 = auVar305._20_4_ * fVar312;
          auVar67._20_4_ = fVar374;
          fVar377 = auVar305._24_4_ * fVar340;
          auVar67._24_4_ = fVar377;
          auVar67._28_4_ = auVar29._28_4_;
          auVar305 = vsubps_avx(auVar24,local_3c0);
          fVar298 = auVar305._0_4_ * fVar298;
          fVar283 = auVar305._4_4_ * fVar283;
          auVar68._4_4_ = fVar283;
          auVar68._0_4_ = fVar298;
          fVar223 = auVar305._8_4_ * fVar223;
          auVar68._8_4_ = fVar223;
          fVar233 = auVar305._12_4_ * fVar233;
          auVar68._12_4_ = fVar233;
          fVar254 = auVar305._16_4_ * fVar254;
          auVar68._16_4_ = fVar254;
          fVar312 = auVar305._20_4_ * fVar312;
          auVar68._20_4_ = fVar312;
          fVar340 = auVar305._24_4_ * fVar340;
          auVar68._24_4_ = fVar340;
          auVar68._28_4_ = 0x80000000;
          fVar292 = fVar314 * (fVar342 * local_680._0_4_ + local_6a0._0_4_);
          fVar224 = fVar225 * (fVar371 * local_680._4_4_ + local_6a0._4_4_);
          fVar226 = fVar234 * (fVar352 * local_680._8_4_ + local_6a0._8_4_);
          fVar228 = fVar255 * (fVar146 * local_680._12_4_ + local_6a0._12_4_);
          fVar230 = fVar315 * (fVar148 * local_680._16_4_ + local_6a0._16_4_);
          fVar232 = fVar357 * (fVar374 * local_680._20_4_ + local_6a0._20_4_);
          fVar324 = fVar321 * (fVar377 * local_680._24_4_ + local_6a0._24_4_);
          auVar133._0_4_ = local_9a0 + fVar292 * fVar333;
          auVar133._4_4_ = fStack_99c + fVar224 * fVar206;
          auVar133._8_4_ = fStack_998 + fVar226 * fVar231;
          auVar133._12_4_ = fStack_994 + fVar228 * fVar253;
          auVar133._16_4_ = fStack_990 + fVar230 * fVar309;
          auVar133._20_4_ = fStack_98c + fVar232 * fVar322;
          auVar133._24_4_ = fStack_988 + fVar324 * fVar368;
          auVar133._28_4_ = fStack_984 + auVar23._28_4_ + auVar27._28_4_ + local_6a0._28_4_;
          auVar69._4_4_ = fVar371 * (float)local_880._4_4_;
          auVar69._0_4_ = fVar342 * (float)local_880._0_4_;
          auVar69._8_4_ = fVar352 * fStack_878;
          auVar69._12_4_ = fVar146 * fStack_874;
          auVar69._16_4_ = fVar148 * fStack_870;
          auVar69._20_4_ = fVar374 * fStack_86c;
          auVar69._24_4_ = fVar377 * fStack_868;
          auVar69._28_4_ = auVar24._28_4_;
          auVar27 = vsubps_avx(auVar69,auVar133);
          auVar17._4_4_ = fVar310;
          auVar17._0_4_ = fVar300;
          auVar17._8_4_ = fVar313;
          auVar17._12_4_ = fVar316;
          auVar17._16_4_ = fVar318;
          auVar17._20_4_ = fVar320;
          auVar17._24_4_ = fVar323;
          auVar17._28_4_ = fVar325;
          auVar248._0_4_ = fVar300 + fVar326 * fVar292;
          auVar248._4_4_ = fVar310 + fVar335 * fVar224;
          auVar248._8_4_ = fVar313 + fVar227 * fVar226;
          auVar248._12_4_ = fVar316 + fVar251 * fVar228;
          auVar248._16_4_ = fVar318 + fVar256 * fVar230;
          auVar248._20_4_ = fVar320 + fVar317 * fVar232;
          auVar248._24_4_ = fVar323 + fVar358 * fVar324;
          auVar248._28_4_ = fVar325 + auVar24._28_4_;
          auVar70._4_4_ = (float)local_8a0._4_4_ * fVar371;
          auVar70._0_4_ = (float)local_8a0._0_4_ * fVar342;
          auVar70._8_4_ = fStack_898 * fVar352;
          auVar70._12_4_ = fStack_894 * fVar146;
          auVar70._16_4_ = fStack_890 * fVar148;
          auVar70._20_4_ = fStack_88c * fVar374;
          auVar70._24_4_ = fStack_888 * fVar377;
          auVar70._28_4_ = 0x3e000000;
          _local_a60 = vsubps_avx(auVar70,auVar248);
          auVar217._0_4_ = fVar153 + fVar311 * fVar292;
          auVar217._4_4_ = fVar178 + fVar152 * fVar224;
          auVar217._8_4_ = fVar180 + fVar229 * fVar226;
          auVar217._12_4_ = fVar181 + fVar252 * fVar228;
          auVar217._16_4_ = fVar183 + fVar299 * fVar230;
          auVar217._20_4_ = fVar184 + fVar319 * fVar232;
          auVar217._24_4_ = fVar186 + fVar365 * fVar324;
          auVar217._28_4_ = fVar187 + auVar305._28_4_;
          auVar71._4_4_ = (float)local_8c0._4_4_ * fVar371;
          auVar71._0_4_ = (float)local_8c0._0_4_ * fVar342;
          auVar71._8_4_ = fStack_8b8 * fVar352;
          auVar71._12_4_ = fStack_8b4 * fVar146;
          auVar71._16_4_ = fStack_8b0 * fVar148;
          auVar71._20_4_ = fStack_8ac * fVar374;
          auVar71._24_4_ = fStack_8a8 * fVar377;
          auVar71._28_4_ = 0x3e000000;
          auVar23 = vsubps_avx(auVar71,auVar217);
          _local_ba0 = auVar23._0_28_;
          fVar314 = fVar314 * (fVar298 * local_680._0_4_ + local_6a0._0_4_);
          fVar225 = fVar225 * (fVar283 * local_680._4_4_ + local_6a0._4_4_);
          fVar234 = fVar234 * (fVar223 * local_680._8_4_ + local_6a0._8_4_);
          fVar255 = fVar255 * (fVar233 * local_680._12_4_ + local_6a0._12_4_);
          fVar315 = fVar315 * (fVar254 * local_680._16_4_ + local_6a0._16_4_);
          fVar357 = fVar357 * (fVar312 * local_680._20_4_ + local_6a0._20_4_);
          fVar321 = fVar321 * (fVar340 * local_680._24_4_ + local_6a0._24_4_);
          auVar218._0_4_ = local_9a0 + fVar314 * fVar333;
          auVar218._4_4_ = fStack_99c + fVar225 * fVar206;
          auVar218._8_4_ = fStack_998 + fVar234 * fVar231;
          auVar218._12_4_ = fStack_994 + fVar255 * fVar253;
          auVar218._16_4_ = fStack_990 + fVar315 * fVar309;
          auVar218._20_4_ = fStack_98c + fVar357 * fVar322;
          auVar218._24_4_ = fStack_988 + fVar321 * fVar368;
          auVar218._28_4_ = fStack_984 + auVar23._28_4_ + local_6a0._28_4_;
          auVar72._4_4_ = fVar283 * (float)local_880._4_4_;
          auVar72._0_4_ = fVar298 * (float)local_880._0_4_;
          auVar72._8_4_ = fVar223 * fStack_878;
          auVar72._12_4_ = fVar233 * fStack_874;
          auVar72._16_4_ = fVar254 * fStack_870;
          auVar72._20_4_ = fVar312 * fStack_86c;
          auVar72._24_4_ = fVar340 * fStack_868;
          auVar72._28_4_ = fStack_864;
          auVar23 = vsubps_avx(auVar72,auVar218);
          auVar222 = ZEXT3264(auVar23);
          auVar277._0_4_ = fVar300 + fVar326 * fVar314;
          auVar277._4_4_ = fVar310 + fVar335 * fVar225;
          auVar277._8_4_ = fVar313 + fVar227 * fVar234;
          auVar277._12_4_ = fVar316 + fVar251 * fVar255;
          auVar277._16_4_ = fVar318 + fVar256 * fVar315;
          auVar277._20_4_ = fVar320 + fVar317 * fVar357;
          auVar277._24_4_ = fVar323 + fVar358 * fVar321;
          auVar277._28_4_ = fVar325 + fStack_864;
          auVar73._4_4_ = (float)local_8a0._4_4_ * fVar283;
          auVar73._0_4_ = (float)local_8a0._0_4_ * fVar298;
          auVar73._8_4_ = fStack_898 * fVar223;
          auVar73._12_4_ = fStack_894 * fVar233;
          auVar73._16_4_ = fStack_890 * fVar254;
          auVar73._20_4_ = fStack_88c * fVar312;
          auVar73._24_4_ = fStack_888 * fVar340;
          auVar73._28_4_ = fStack_884;
          auVar23 = vsubps_avx(auVar73,auVar277);
          auVar275 = auVar23._0_28_;
          auVar263._0_4_ = fVar153 + fVar311 * fVar314;
          auVar263._4_4_ = fVar178 + fVar152 * fVar225;
          auVar263._8_4_ = fVar180 + fVar229 * fVar234;
          auVar263._12_4_ = fVar181 + fVar252 * fVar255;
          auVar263._16_4_ = fVar183 + fVar299 * fVar315;
          auVar263._20_4_ = fVar184 + fVar319 * fVar357;
          auVar263._24_4_ = fVar186 + fVar365 * fVar321;
          auVar263._28_4_ = fVar187 + 0.125;
          auVar74._4_4_ = (float)local_8c0._4_4_ * fVar283;
          auVar74._0_4_ = (float)local_8c0._0_4_ * fVar298;
          auVar74._8_4_ = fStack_8b8 * fVar223;
          auVar74._12_4_ = fStack_8b4 * fVar233;
          auVar74._16_4_ = fStack_8b0 * fVar254;
          auVar74._20_4_ = fStack_8ac * fVar312;
          auVar74._24_4_ = fStack_8a8 * fVar340;
          auVar74._28_4_ = fStack_884;
          auVar23 = vsubps_avx(auVar74,auVar263);
          auVar262 = auVar23._0_28_;
          auVar202 = vcmpps_avx(auVar202,ZEXT832(0) << 0x20,5);
          auVar296._8_4_ = 0x7f800000;
          auVar296._0_8_ = 0x7f8000007f800000;
          auVar296._12_4_ = 0x7f800000;
          auVar296._16_4_ = 0x7f800000;
          auVar296._20_4_ = 0x7f800000;
          auVar296._24_4_ = 0x7f800000;
          auVar296._28_4_ = 0x7f800000;
          auVar295 = vblendvps_avx(auVar296,auVar67,auVar202);
          auVar23 = vmaxps_avx(local_620,local_3a0);
          auVar75._4_4_ = auVar23._4_4_ * 1.9073486e-06;
          auVar75._0_4_ = auVar23._0_4_ * 1.9073486e-06;
          auVar75._8_4_ = auVar23._8_4_ * 1.9073486e-06;
          auVar75._12_4_ = auVar23._12_4_ * 1.9073486e-06;
          auVar75._16_4_ = auVar23._16_4_ * 1.9073486e-06;
          auVar75._20_4_ = auVar23._20_4_ * 1.9073486e-06;
          auVar75._24_4_ = auVar23._24_4_ * 1.9073486e-06;
          auVar75._28_4_ = auVar23._28_4_;
          auVar23 = vcmpps_avx(local_2c0,auVar75,1);
          auVar348._8_4_ = 0xff800000;
          auVar348._0_8_ = 0xff800000ff800000;
          auVar348._12_4_ = 0xff800000;
          auVar348._16_4_ = 0xff800000;
          auVar348._20_4_ = 0xff800000;
          auVar348._24_4_ = 0xff800000;
          auVar348._28_4_ = 0xff800000;
          auVar347 = vblendvps_avx(auVar348,auVar68,auVar202);
          auVar24 = auVar202 & auVar23;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            auVar25 = vandps_avx(auVar23,auVar202);
            auVar167 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
            auVar23 = vcmpps_avx(auVar22,_DAT_01f7b000,2);
            auVar143._8_4_ = 0xff800000;
            auVar143._0_8_ = 0xff800000ff800000;
            auVar143._12_4_ = 0xff800000;
            auVar143._16_4_ = 0xff800000;
            auVar143._20_4_ = 0xff800000;
            auVar143._24_4_ = 0xff800000;
            auVar143._28_4_ = 0xff800000;
            auVar177._8_4_ = 0x7f800000;
            auVar177._0_8_ = 0x7f8000007f800000;
            auVar177._12_4_ = 0x7f800000;
            auVar177._16_4_ = 0x7f800000;
            auVar177._20_4_ = 0x7f800000;
            auVar177._24_4_ = 0x7f800000;
            auVar177._28_4_ = 0x7f800000;
            auVar22 = vblendvps_avx(auVar177,auVar143,auVar23);
            auVar211 = vpmovsxwd_avx(auVar167);
            auVar167 = vpunpckhwd_avx(auVar167,auVar167);
            auVar395._16_16_ = auVar167;
            auVar395._0_16_ = auVar211;
            auVar295 = vblendvps_avx(auVar295,auVar22,auVar395);
            auVar22 = vblendvps_avx(auVar143,auVar177,auVar23);
            auVar347 = vblendvps_avx(auVar347,auVar22,auVar395);
            auVar205._0_8_ = auVar25._0_8_ ^ 0xffffffffffffffff;
            auVar205._8_4_ = auVar25._8_4_ ^ 0xffffffff;
            auVar205._12_4_ = auVar25._12_4_ ^ 0xffffffff;
            auVar205._16_4_ = auVar25._16_4_ ^ 0xffffffff;
            auVar205._20_4_ = auVar25._20_4_ ^ 0xffffffff;
            auVar205._24_4_ = auVar25._24_4_ ^ 0xffffffff;
            auVar205._28_4_ = auVar25._28_4_ ^ 0xffffffff;
            auVar17 = vorps_avx(auVar23,auVar205);
            auVar25 = vandps_avx(auVar202,auVar17);
          }
          auVar242 = auVar27._0_28_;
        }
        _local_460 = local_8e0;
        local_440 = vminps_avx(local_400,auVar295);
        auVar202 = vmaxps_avx(local_8e0,auVar347);
        _local_420 = auVar202;
        auVar22 = vcmpps_avx(local_8e0,local_440,2);
        auVar297 = ZEXT3264(auVar22);
        local_ae0 = vandps_avx(auVar22,auVar106);
        auVar349 = ZEXT3264(local_ae0);
        auVar22 = vcmpps_avx(auVar202,local_400,2);
        auVar106 = vandps_avx(auVar22,auVar106);
        auVar22 = vorps_avx(local_ae0,auVar106);
        if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0x7f,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0xbf,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar22[0x1f]) {
          auVar307 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
        }
        else {
          auVar297 = ZEXT3264(_local_8a0);
          auVar171._0_8_ = auVar25._0_8_ ^ 0xffffffffffffffff;
          auVar171._8_4_ = auVar25._8_4_ ^ 0xffffffff;
          auVar171._12_4_ = auVar25._12_4_ ^ 0xffffffff;
          auVar171._16_4_ = auVar25._16_4_ ^ 0xffffffff;
          auVar171._20_4_ = auVar25._20_4_ ^ 0xffffffff;
          auVar171._24_4_ = auVar25._24_4_ ^ 0xffffffff;
          auVar171._28_4_ = auVar25._28_4_ ^ 0xffffffff;
          auVar111._0_4_ =
               (float)local_880._0_4_ * auVar222._0_4_ +
               (float)local_8a0._0_4_ * auVar275._0_4_ + (float)local_8c0._0_4_ * auVar262._0_4_;
          auVar111._4_4_ =
               (float)local_880._4_4_ * auVar222._4_4_ +
               (float)local_8a0._4_4_ * auVar275._4_4_ + (float)local_8c0._4_4_ * auVar262._4_4_;
          auVar111._8_4_ =
               fStack_878 * auVar222._8_4_ +
               fStack_898 * auVar275._8_4_ + fStack_8b8 * auVar262._8_4_;
          auVar111._12_4_ =
               fStack_874 * auVar222._12_4_ +
               fStack_894 * auVar275._12_4_ + fStack_8b4 * auVar262._12_4_;
          auVar111._16_4_ =
               fStack_870 * auVar222._16_4_ +
               fStack_890 * auVar275._16_4_ + fStack_8b0 * auVar262._16_4_;
          auVar111._20_4_ =
               fStack_86c * auVar222._20_4_ +
               fStack_88c * auVar275._20_4_ + fStack_8ac * auVar262._20_4_;
          auVar111._24_4_ =
               fStack_868 * auVar222._24_4_ +
               fStack_888 * auVar275._24_4_ + fStack_8a8 * auVar262._24_4_;
          auVar111._28_4_ = auVar17._28_4_ + auVar106._28_4_ + auVar22._28_4_;
          auVar219._8_4_ = 0x7fffffff;
          auVar219._0_8_ = 0x7fffffff7fffffff;
          auVar219._12_4_ = 0x7fffffff;
          auVar219._16_4_ = 0x7fffffff;
          auVar219._20_4_ = 0x7fffffff;
          auVar219._24_4_ = 0x7fffffff;
          auVar219._28_4_ = 0x7fffffff;
          auVar25 = vandps_avx(auVar111,auVar219);
          auVar264._8_4_ = 0x3e99999a;
          auVar264._0_8_ = 0x3e99999a3e99999a;
          auVar264._12_4_ = 0x3e99999a;
          auVar264._16_4_ = 0x3e99999a;
          auVar264._20_4_ = 0x3e99999a;
          auVar264._24_4_ = 0x3e99999a;
          auVar264._28_4_ = 0x3e99999a;
          auVar25 = vcmpps_avx(auVar25,auVar264,1);
          local_820 = vorps_avx(auVar25,auVar171);
          auVar112._0_4_ =
               (float)local_880._0_4_ * auVar242._0_4_ +
               (float)local_8a0._0_4_ * (float)local_a60._0_4_ +
               (float)local_8c0._0_4_ * (float)local_ba0._0_4_;
          auVar112._4_4_ =
               (float)local_880._4_4_ * auVar242._4_4_ +
               (float)local_8a0._4_4_ * (float)local_a60._4_4_ +
               (float)local_8c0._4_4_ * (float)local_ba0._4_4_;
          auVar112._8_4_ =
               fStack_878 * auVar242._8_4_ + fStack_898 * fStack_a58 + fStack_8b8 * fStack_b98;
          auVar112._12_4_ =
               fStack_874 * auVar242._12_4_ + fStack_894 * fStack_a54 + fStack_8b4 * fStack_b94;
          auVar112._16_4_ =
               fStack_870 * auVar242._16_4_ + fStack_890 * fStack_a50 + fStack_8b0 * fStack_b90;
          auVar112._20_4_ =
               fStack_86c * auVar242._20_4_ + fStack_88c * fStack_a4c + fStack_8ac * fStack_b8c;
          auVar112._24_4_ =
               fStack_868 * auVar242._24_4_ + fStack_888 * fStack_a48 + fStack_8a8 * fStack_b88;
          auVar112._28_4_ = local_820._28_4_ + fStack_864 + auVar17._28_4_;
          auVar25 = vandps_avx(auVar112,auVar219);
          auVar25 = vcmpps_avx(auVar25,auVar264,1);
          auVar25 = vorps_avx(auVar25,auVar171);
          auVar134._8_4_ = 3;
          auVar134._0_8_ = 0x300000003;
          auVar134._12_4_ = 3;
          auVar134._16_4_ = 3;
          auVar134._20_4_ = 3;
          auVar134._24_4_ = 3;
          auVar134._28_4_ = 3;
          auVar172._8_4_ = 2;
          auVar172._0_8_ = 0x200000002;
          auVar172._12_4_ = 2;
          auVar172._16_4_ = 2;
          auVar172._20_4_ = 2;
          auVar172._24_4_ = 2;
          auVar172._28_4_ = 2;
          auVar25 = vblendvps_avx(auVar172,auVar134,auVar25);
          local_840 = ZEXT432(local_d24);
          local_860 = vpshufd_avx(ZEXT416(local_d24),0);
          auVar167 = vpcmpgtd_avx(auVar25._16_16_,local_860);
          auStack_850 = auVar26._16_16_;
          auVar211 = vpcmpgtd_avx(auVar25._0_16_,local_860);
          auVar135._16_16_ = auVar167;
          auVar135._0_16_ = auVar211;
          local_800 = vblendps_avx(ZEXT1632(auVar211),auVar135,0xf0);
          local_480 = vandnps_avx(local_800,local_ae0);
          local_940._4_4_ = local_8e0._4_4_ + fVar308;
          local_940._0_4_ = local_8e0._0_4_ + fVar280;
          fStack_938 = local_8e0._8_4_ + fVar331;
          fStack_934 = local_8e0._12_4_ + fVar281;
          fStack_930 = local_8e0._16_4_ + fVar280;
          fStack_92c = local_8e0._20_4_ + fVar308;
          fStack_928 = local_8e0._24_4_ + fVar331;
          fStack_924 = local_8e0._28_4_ + fVar281;
          auVar307 = ZEXT3264(local_ae0);
          while( true ) {
            local_c50 = auVar20._0_4_;
            fStack_c4c = auVar20._4_4_;
            fStack_c48 = auVar20._8_4_;
            fStack_c44 = auVar20._12_4_;
            local_c60 = auVar21._0_4_;
            fStack_c5c = auVar21._4_4_;
            fStack_c58 = auVar21._8_4_;
            fStack_c54 = auVar21._12_4_;
            local_cf0 = auVar15._0_4_;
            fStack_cec = auVar15._4_4_;
            fStack_ce8 = auVar15._8_4_;
            fStack_ce4 = auVar15._12_4_;
            if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_480 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_480 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_480 >> 0x7f,0) == '\0') &&
                  (local_480 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_480 >> 0xbf,0) == '\0') &&
                (local_480 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_480[0x1f]) break;
            auVar136._8_4_ = 0x7f800000;
            auVar136._0_8_ = 0x7f8000007f800000;
            auVar136._12_4_ = 0x7f800000;
            auVar136._16_4_ = 0x7f800000;
            auVar136._20_4_ = 0x7f800000;
            auVar136._24_4_ = 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar25 = vblendvps_avx(auVar136,local_8e0,local_480);
            auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
            auVar26 = vminps_avx(auVar25,auVar26);
            auVar22 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar22 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar26 = vcmpps_avx(auVar25,auVar26,0);
            auVar22 = local_480 & auVar26;
            auVar25 = local_480;
            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0x7f,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0xbf,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar22[0x1f] < '\0') {
              auVar25 = vandps_avx(auVar26,local_480);
            }
            uVar88 = vmovmskps_avx(auVar25);
            uVar90 = 0;
            if (uVar88 != 0) {
              for (; (uVar88 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
              }
            }
            uVar86 = (ulong)uVar90;
            *(undefined4 *)(local_480 + uVar86 * 4) = 0;
            fVar298 = local_1a0[uVar86];
            uVar90 = *(uint *)(local_460 + uVar86 * 4);
            fVar326 = auVar120._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              auVar297 = ZEXT1664(auVar297._0_16_);
              auVar349 = ZEXT1664(auVar349._0_16_);
              fVar326 = sqrtf((float)local_9c0._0_4_);
              uVar86 = extraout_RAX;
            }
            auVar211 = vminps_avx(auVar15,auVar21);
            auVar167 = vmaxps_avx(auVar15,auVar21);
            auVar161 = vminps_avx(auVar20,_local_af0);
            auVar100 = vminps_avx(auVar211,auVar161);
            auVar211 = vmaxps_avx(auVar20,_local_af0);
            auVar161 = vmaxps_avx(auVar167,auVar211);
            auVar192._8_4_ = 0x7fffffff;
            auVar192._0_8_ = 0x7fffffff7fffffff;
            auVar192._12_4_ = 0x7fffffff;
            auVar167 = vandps_avx(auVar100,auVar192);
            auVar211 = vandps_avx(auVar161,auVar192);
            auVar167 = vmaxps_avx(auVar167,auVar211);
            auVar211 = vmovshdup_avx(auVar167);
            auVar211 = vmaxss_avx(auVar211,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar211);
            local_9a0 = auVar167._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar326 * 1.9073486e-06;
            local_920._0_16_ = vshufps_avx(auVar161,auVar161,0xff);
            auVar167 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar298),0x10);
            for (uVar93 = 0; bVar84 = (byte)uVar86, uVar93 != 5; uVar93 = uVar93 + 1) {
              auVar211 = vshufps_avx(auVar167,auVar167,0);
              auVar99._0_4_ = auVar211._0_4_ * (float)local_9b0._0_4_ + 0.0;
              auVar99._4_4_ = auVar211._4_4_ * (float)local_9b0._4_4_ + 0.0;
              auVar99._8_4_ = auVar211._8_4_ * fStack_9a8 + 0.0;
              auVar99._12_4_ = auVar211._12_4_ * fStack_9a4 + 0.0;
              auVar211 = vmovshdup_avx(auVar167);
              fVar314 = auVar211._0_4_;
              fVar333 = 1.0 - fVar314;
              fVar326 = fVar314 * 3.0;
              fVar298 = fVar326 + -5.0;
              fVar311 = fVar333 * fVar333;
              auVar211 = ZEXT416((uint)(fVar314 * fVar314 * -fVar333 * 0.5));
              auVar211 = vshufps_avx(auVar211,auVar211,0);
              auVar161 = ZEXT416((uint)((fVar311 * (fVar333 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar100 = ZEXT416((uint)((fVar314 * fVar314 * fVar298 + 2.0) * 0.5));
              auVar100 = vshufps_avx(auVar100,auVar100,0);
              auVar121 = ZEXT416((uint)(fVar333 * fVar333 * -fVar314 * 0.5));
              auVar121 = vshufps_avx(auVar121,auVar121,0);
              auVar158._0_4_ =
                   auVar121._0_4_ * local_cf0 +
                   auVar100._0_4_ * local_c60 +
                   auVar161._0_4_ * local_c50 + auVar211._0_4_ * (float)local_af0._0_4_;
              auVar158._4_4_ =
                   auVar121._4_4_ * fStack_cec +
                   auVar100._4_4_ * fStack_c5c +
                   auVar161._4_4_ * fStack_c4c + auVar211._4_4_ * (float)local_af0._4_4_;
              auVar158._8_4_ =
                   auVar121._8_4_ * fStack_ce8 +
                   auVar100._8_4_ * fStack_c58 +
                   auVar161._8_4_ * fStack_c48 + auVar211._8_4_ * fStack_ae8;
              auVar158._12_4_ =
                   auVar121._12_4_ * fStack_ce4 +
                   auVar100._12_4_ * fStack_c54 +
                   auVar161._12_4_ * fStack_c44 + auVar211._12_4_ * fStack_ae4;
              _local_a60 = auVar158;
              auVar211 = vsubps_avx(auVar99,auVar158);
              _local_a40 = auVar211;
              auVar211 = vdpps_avx(auVar211,auVar211,0x7f);
              fVar283 = auVar211._0_4_;
              if (fVar283 < 0.0) {
                local_9e0._0_4_ = fVar314 * 9.0;
                local_a00._0_4_ = fVar298;
                local_a20._0_4_ = fVar311;
                local_900._0_4_ = fVar333 * -2.0;
                fVar335 = sqrtf(fVar283);
                uVar86 = extraout_RAX_00;
                fVar298 = (float)local_a00._0_4_;
                fVar206 = (float)local_9e0._0_4_;
                fVar152 = (float)local_900._0_4_;
                fVar311 = (float)local_a20._0_4_;
              }
              else {
                auVar161 = vsqrtss_avx(auVar211,auVar211);
                fVar335 = auVar161._0_4_;
                fVar206 = fVar314 * 9.0;
                fVar152 = fVar333 * -2.0;
              }
              auVar161 = ZEXT416((uint)((fVar314 * fVar314 + fVar314 * fVar152) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar100 = ZEXT416((uint)(((fVar333 + fVar333) * (fVar326 + 2.0) +
                                        fVar333 * fVar333 * -3.0) * 0.5));
              auVar100 = vshufps_avx(auVar100,auVar100,0);
              auVar121 = ZEXT416((uint)((fVar298 * (fVar314 + fVar314) + fVar314 * fVar326) * 0.5));
              auVar121 = vshufps_avx(auVar121,auVar121,0);
              auVar95 = ZEXT416((uint)((fVar314 * (fVar333 + fVar333) - fVar311) * 0.5));
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              auVar346._0_4_ =
                   local_cf0 * auVar95._0_4_ +
                   local_c60 * auVar121._0_4_ +
                   (float)local_af0._0_4_ * auVar161._0_4_ + local_c50 * auVar100._0_4_;
              auVar346._4_4_ =
                   fStack_cec * auVar95._4_4_ +
                   fStack_c5c * auVar121._4_4_ +
                   (float)local_af0._4_4_ * auVar161._4_4_ + fStack_c4c * auVar100._4_4_;
              auVar346._8_4_ =
                   fStack_ce8 * auVar95._8_4_ +
                   fStack_c58 * auVar121._8_4_ +
                   fStack_ae8 * auVar161._8_4_ + fStack_c48 * auVar100._8_4_;
              auVar346._12_4_ =
                   fStack_ce4 * auVar95._12_4_ +
                   fStack_c54 * auVar121._12_4_ +
                   fStack_ae4 * auVar161._12_4_ + fStack_c44 * auVar100._12_4_;
              auVar95 = vpermilps_avx(ZEXT416((uint)(fVar326 + -1.0)),0);
              auVar96 = vpermilps_avx(ZEXT416((uint)(fVar314 * -9.0 + 4.0)),0);
              auVar161 = vshufps_avx(ZEXT416((uint)(fVar206 + -5.0)),ZEXT416((uint)(fVar206 + -5.0))
                                     ,0);
              auVar100 = ZEXT416((uint)(fVar314 * -3.0 + 2.0));
              auVar121 = vshufps_avx(auVar100,auVar100,0);
              auVar100 = vdpps_avx(auVar346,auVar346,0x7f);
              auVar122._0_4_ =
                   local_cf0 * auVar121._0_4_ +
                   local_c60 * auVar161._0_4_ +
                   local_c50 * auVar96._0_4_ + (float)local_af0._0_4_ * auVar95._0_4_;
              auVar122._4_4_ =
                   fStack_cec * auVar121._4_4_ +
                   fStack_c5c * auVar161._4_4_ +
                   fStack_c4c * auVar96._4_4_ + (float)local_af0._4_4_ * auVar95._4_4_;
              auVar122._8_4_ =
                   fStack_ce8 * auVar121._8_4_ +
                   fStack_c58 * auVar161._8_4_ +
                   fStack_c48 * auVar96._8_4_ + fStack_ae8 * auVar95._8_4_;
              auVar122._12_4_ =
                   fStack_ce4 * auVar121._12_4_ +
                   fStack_c54 * auVar161._12_4_ +
                   fStack_c44 * auVar96._12_4_ + fStack_ae4 * auVar95._12_4_;
              auVar161 = vblendps_avx(auVar100,_DAT_01f45a50,0xe);
              auVar121 = vrsqrtss_avx(auVar161,auVar161);
              fVar326 = auVar121._0_4_;
              fVar298 = auVar100._0_4_;
              auVar121 = vdpps_avx(auVar346,auVar122,0x7f);
              auVar95 = vshufps_avx(auVar100,auVar100,0);
              auVar123._0_4_ = auVar122._0_4_ * auVar95._0_4_;
              auVar123._4_4_ = auVar122._4_4_ * auVar95._4_4_;
              auVar123._8_4_ = auVar122._8_4_ * auVar95._8_4_;
              auVar123._12_4_ = auVar122._12_4_ * auVar95._12_4_;
              auVar121 = vshufps_avx(auVar121,auVar121,0);
              auVar212._0_4_ = auVar346._0_4_ * auVar121._0_4_;
              auVar212._4_4_ = auVar346._4_4_ * auVar121._4_4_;
              auVar212._8_4_ = auVar346._8_4_ * auVar121._8_4_;
              auVar212._12_4_ = auVar346._12_4_ * auVar121._12_4_;
              auVar96 = vsubps_avx(auVar123,auVar212);
              auVar121 = vrcpss_avx(auVar161,auVar161);
              auVar161 = vmaxss_avx(ZEXT416((uint)local_9a0),
                                    ZEXT416((uint)(auVar167._0_4_ * (float)local_980._0_4_)));
              auVar121 = ZEXT416((uint)(auVar121._0_4_ * (2.0 - fVar298 * auVar121._0_4_)));
              auVar121 = vshufps_avx(auVar121,auVar121,0);
              uVar76 = CONCAT44(auVar346._4_4_,auVar346._0_4_);
              auVar238._0_8_ = uVar76 ^ 0x8000000080000000;
              auVar238._8_4_ = -auVar346._8_4_;
              auVar238._12_4_ = -auVar346._12_4_;
              auVar95 = ZEXT416((uint)(fVar326 * 1.5 + fVar298 * -0.5 * fVar326 * fVar326 * fVar326)
                               );
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              auVar193._0_4_ = auVar95._0_4_ * auVar96._0_4_ * auVar121._0_4_;
              auVar193._4_4_ = auVar95._4_4_ * auVar96._4_4_ * auVar121._4_4_;
              auVar193._8_4_ = auVar95._8_4_ * auVar96._8_4_ * auVar121._8_4_;
              auVar193._12_4_ = auVar95._12_4_ * auVar96._12_4_ * auVar121._12_4_;
              auVar260._0_4_ = auVar346._0_4_ * auVar95._0_4_;
              auVar260._4_4_ = auVar346._4_4_ * auVar95._4_4_;
              auVar260._8_4_ = auVar346._8_4_ * auVar95._8_4_;
              auVar260._12_4_ = auVar346._12_4_ * auVar95._12_4_;
              if (fVar298 < 0.0) {
                fVar298 = sqrtf(fVar298);
                uVar86 = extraout_RAX_01;
              }
              else {
                auVar100 = vsqrtss_avx(auVar100,auVar100);
                fVar298 = auVar100._0_4_;
              }
              auVar100 = vdpps_avx(_local_a40,auVar260,0x7f);
              fVar298 = (local_9a0 / fVar298) * (fVar335 + 1.0) +
                        auVar161._0_4_ + fVar335 * local_9a0;
              auVar121 = vdpps_avx(auVar238,auVar260,0x7f);
              auVar95 = vdpps_avx(_local_a40,auVar193,0x7f);
              auVar96 = vdpps_avx(_local_9b0,auVar260,0x7f);
              auVar97 = vdpps_avx(_local_a40,auVar238,0x7f);
              fVar326 = auVar121._0_4_ + auVar95._0_4_;
              fVar311 = auVar100._0_4_;
              auVar101._0_4_ = fVar311 * fVar311;
              auVar101._4_4_ = auVar100._4_4_ * auVar100._4_4_;
              auVar101._8_4_ = auVar100._8_4_ * auVar100._8_4_;
              auVar101._12_4_ = auVar100._12_4_ * auVar100._12_4_;
              auVar95 = vsubps_avx(auVar211,auVar101);
              auVar121 = vdpps_avx(_local_a40,_local_9b0,0x7f);
              fVar333 = auVar97._0_4_ - fVar311 * fVar326;
              fVar314 = auVar121._0_4_ - fVar311 * auVar96._0_4_;
              auVar121 = vrsqrtss_avx(auVar95,auVar95);
              fVar335 = auVar95._0_4_;
              fVar311 = auVar121._0_4_;
              fVar311 = fVar311 * 1.5 + fVar335 * -0.5 * fVar311 * fVar311 * fVar311;
              if (fVar335 < 0.0) {
                local_9e0._0_4_ = fVar333;
                local_a00._0_4_ = fVar314;
                local_a20._0_4_ = fVar311;
                fVar335 = sqrtf(fVar335);
                uVar86 = extraout_RAX_02;
                fVar311 = (float)local_a20._0_4_;
                fVar333 = (float)local_9e0._0_4_;
                fVar314 = (float)local_a00._0_4_;
              }
              else {
                auVar121 = vsqrtss_avx(auVar95,auVar95);
                fVar335 = auVar121._0_4_;
              }
              auVar349 = ZEXT1664(auVar100);
              auVar297 = ZEXT1664(auVar211);
              auVar97 = vpermilps_avx(_local_a60,0xff);
              auVar156 = vshufps_avx(auVar346,auVar346,0xff);
              fVar333 = fVar333 * fVar311 - auVar156._0_4_;
              auVar213._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
              auVar213._8_4_ = auVar96._8_4_ ^ 0x80000000;
              auVar213._12_4_ = auVar96._12_4_ ^ 0x80000000;
              auVar239._0_4_ = -fVar333;
              auVar239._4_4_ = 0x80000000;
              auVar239._8_4_ = 0x80000000;
              auVar239._12_4_ = 0x80000000;
              auVar121 = vinsertps_avx(auVar239,ZEXT416((uint)(fVar314 * fVar311)),0x1c);
              auVar96 = vmovsldup_avx(ZEXT416((uint)(fVar326 * fVar314 * fVar311 -
                                                    auVar96._0_4_ * fVar333)));
              auVar121 = vdivps_avx(auVar121,auVar96);
              auVar95 = vinsertps_avx(ZEXT416((uint)fVar326),auVar213,0x10);
              auVar95 = vdivps_avx(auVar95,auVar96);
              auVar96 = vmovsldup_avx(auVar100);
              auVar102 = ZEXT416((uint)(fVar335 - auVar97._0_4_));
              auVar97 = vmovsldup_avx(auVar102);
              auVar159._0_4_ = auVar96._0_4_ * auVar121._0_4_ + auVar97._0_4_ * auVar95._0_4_;
              auVar159._4_4_ = auVar96._4_4_ * auVar121._4_4_ + auVar97._4_4_ * auVar95._4_4_;
              auVar159._8_4_ = auVar96._8_4_ * auVar121._8_4_ + auVar97._8_4_ * auVar95._8_4_;
              auVar159._12_4_ = auVar96._12_4_ * auVar121._12_4_ + auVar97._12_4_ * auVar95._12_4_;
              auVar167 = vsubps_avx(auVar167,auVar159);
              auVar160._8_4_ = 0x7fffffff;
              auVar160._0_8_ = 0x7fffffff7fffffff;
              auVar160._12_4_ = 0x7fffffff;
              auVar100 = vandps_avx(auVar100,auVar160);
              if (auVar100._0_4_ < fVar298) {
                auVar194._8_4_ = 0x7fffffff;
                auVar194._0_8_ = 0x7fffffff7fffffff;
                auVar194._12_4_ = 0x7fffffff;
                auVar100 = vandps_avx(auVar102,auVar194);
                if (auVar100._0_4_ <
                    (float)local_920._0_4_ * 1.9073486e-06 + auVar161._0_4_ + fVar298) {
                  bVar94 = uVar93 < 5;
                  fVar298 = auVar167._0_4_ + (float)local_960._0_4_;
                  if (fVar298 < fVar271) {
                    bVar84 = 0;
                    goto LAB_0093278e;
                  }
                  fVar326 = *(float *)(ray + k * 4 + 0x100);
                  auVar349 = ZEXT464((uint)fVar326);
                  auVar307 = ZEXT3264(local_ae0);
                  if (fVar298 <= fVar326) {
                    auVar161 = vmovshdup_avx(auVar167);
                    bVar84 = 0;
                    if ((auVar161._0_4_ < 0.0) || (1.0 < auVar161._0_4_)) goto LAB_009327b2;
                    auVar161 = vrsqrtss_avx(auVar211,auVar211);
                    fVar311 = auVar161._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_a98].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar84 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar161 = ZEXT416((uint)(fVar311 * 1.5 +
                                                 fVar283 * -0.5 * fVar311 * fVar311 * fVar311));
                        auVar161 = vshufps_avx(auVar161,auVar161,0);
                        auVar162._0_4_ = auVar161._0_4_ * (float)local_a40._0_4_;
                        auVar162._4_4_ = auVar161._4_4_ * (float)local_a40._4_4_;
                        auVar162._8_4_ = auVar161._8_4_ * fStack_a38;
                        auVar162._12_4_ = auVar161._12_4_ * fStack_a34;
                        auVar124._0_4_ = auVar346._0_4_ + auVar156._0_4_ * auVar162._0_4_;
                        auVar124._4_4_ = auVar346._4_4_ + auVar156._4_4_ * auVar162._4_4_;
                        auVar124._8_4_ = auVar346._8_4_ + auVar156._8_4_ * auVar162._8_4_;
                        auVar124._12_4_ = auVar346._12_4_ + auVar156._12_4_ * auVar162._12_4_;
                        auVar161 = vshufps_avx(auVar162,auVar162,0xc9);
                        auVar100 = vshufps_avx(auVar346,auVar346,0xc9);
                        auVar163._0_4_ = auVar100._0_4_ * auVar162._0_4_;
                        auVar163._4_4_ = auVar100._4_4_ * auVar162._4_4_;
                        auVar163._8_4_ = auVar100._8_4_ * auVar162._8_4_;
                        auVar163._12_4_ = auVar100._12_4_ * auVar162._12_4_;
                        auVar195._0_4_ = auVar346._0_4_ * auVar161._0_4_;
                        auVar195._4_4_ = auVar346._4_4_ * auVar161._4_4_;
                        auVar195._8_4_ = auVar346._8_4_ * auVar161._8_4_;
                        auVar195._12_4_ = auVar346._12_4_ * auVar161._12_4_;
                        auVar121 = vsubps_avx(auVar195,auVar163);
                        auVar161 = vshufps_avx(auVar121,auVar121,0xc9);
                        auVar100 = vshufps_avx(auVar124,auVar124,0xc9);
                        auVar196._0_4_ = auVar100._0_4_ * auVar161._0_4_;
                        auVar196._4_4_ = auVar100._4_4_ * auVar161._4_4_;
                        auVar196._8_4_ = auVar100._8_4_ * auVar161._8_4_;
                        auVar196._12_4_ = auVar100._12_4_ * auVar161._12_4_;
                        auVar161 = vshufps_avx(auVar121,auVar121,0xd2);
                        auVar125._0_4_ = auVar124._0_4_ * auVar161._0_4_;
                        auVar125._4_4_ = auVar124._4_4_ * auVar161._4_4_;
                        auVar125._8_4_ = auVar124._8_4_ * auVar161._8_4_;
                        auVar125._12_4_ = auVar124._12_4_ * auVar161._12_4_;
                        auVar161 = vsubps_avx(auVar196,auVar125);
                        pRVar13 = context->user;
                        local_760 = vshufps_avx(auVar167,auVar167,0x55);
                        auStack_7b0 = vshufps_avx(auVar161,auVar161,0x55);
                        local_7a0 = vshufps_avx(auVar161,auVar161,0xaa);
                        local_780 = vshufps_avx(auVar161,auVar161,0);
                        local_7c0 = (RTCHitN  [16])auStack_7b0;
                        local_740 = ZEXT832(0) << 0x20;
                        local_720 = local_660._0_8_;
                        uStack_718 = local_660._8_8_;
                        uStack_710 = local_660._16_8_;
                        uStack_708 = local_660._24_8_;
                        local_700 = local_640;
                        auVar25 = vcmpps_avx(local_640,local_640,0xf);
                        local_aa0[1] = auVar25;
                        *local_aa0 = auVar25;
                        local_6e0 = pRVar13->instID[0];
                        local_6c0 = pRVar13->instPrimID[0];
                        *(float *)(ray + k * 4 + 0x100) = fVar298;
                        local_b20 = *local_aa8;
                        local_b10 = *local_ab0;
                        local_a90.valid = (int *)local_b20;
                        local_a90.geometryUserPtr = pGVar9->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_7c0;
                        local_a90.N = 8;
                        local_a90.ray = (RTCRayN *)ray;
                        local_790 = local_7a0;
                        local_770 = local_780;
                        local_750 = local_760;
                        uStack_6dc = local_6e0;
                        uStack_6d8 = local_6e0;
                        uStack_6d4 = local_6e0;
                        uStack_6d0 = local_6e0;
                        uStack_6cc = local_6e0;
                        uStack_6c8 = local_6e0;
                        uStack_6c4 = local_6e0;
                        uStack_6bc = local_6c0;
                        uStack_6b8 = local_6c0;
                        uStack_6b4 = local_6c0;
                        uStack_6b0 = local_6c0;
                        uStack_6ac = local_6c0;
                        uStack_6a8 = local_6c0;
                        uStack_6a4 = local_6c0;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar297 = ZEXT1664(auVar211);
                          (*pGVar9->occlusionFilterN)(&local_a90);
                        }
                        auVar167 = vpcmpeqd_avx(local_b20,ZEXT816(0) << 0x40);
                        auVar211 = vpcmpeqd_avx(local_b10,ZEXT816(0) << 0x40);
                        auVar173._16_16_ = auVar211;
                        auVar173._0_16_ = auVar167;
                        auVar25 = _DAT_01f7b020 & ~auVar173;
                        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar25 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar25 >> 0x7f,0) == '\0') &&
                              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar25 >> 0xbf,0) == '\0') &&
                            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar25[0x1f]) {
                          auVar307 = ZEXT3264(local_ae0);
LAB_00932b84:
                          *(float *)(ray + k * 4 + 0x100) = fVar326;
                          bVar84 = 0;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar297 = ZEXT1664(auVar297._0_16_);
                            (*p_Var14)(&local_a90);
                          }
                          auVar167 = vpcmpeqd_avx(local_b20,ZEXT816(0) << 0x40);
                          auVar211 = vpcmpeqd_avx(local_b10,ZEXT816(0) << 0x40);
                          auVar113._16_16_ = auVar211;
                          auVar113._0_16_ = auVar167;
                          auVar137._8_4_ = 0xff800000;
                          auVar137._0_8_ = 0xff800000ff800000;
                          auVar137._12_4_ = 0xff800000;
                          auVar137._16_4_ = 0xff800000;
                          auVar137._20_4_ = 0xff800000;
                          auVar137._24_4_ = 0xff800000;
                          auVar137._28_4_ = 0xff800000;
                          auVar25 = vblendvps_avx(auVar137,*(undefined1 (*) [32])
                                                            (local_a90.ray + 0x100),auVar113);
                          *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar25;
                          auVar25 = _DAT_01f7b020 & ~auVar113;
                          auVar307 = ZEXT3264(local_ae0);
                          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar25 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar25 >> 0x7f,0) == '\0') &&
                                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar25 >> 0xbf,0) == '\0') &&
                              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar25[0x1f]) goto LAB_00932b84;
                          bVar84 = 1;
                        }
                        auVar349 = ZEXT464((uint)fVar326);
                      }
                      goto LAB_009327b2;
                    }
                  }
                  bVar84 = 0;
                  goto LAB_009327b2;
                }
              }
            }
            bVar94 = false;
LAB_0093278e:
            auVar307 = ZEXT3264(local_ae0);
LAB_009327b2:
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar108._4_4_ = uVar7;
            auVar108._0_4_ = uVar7;
            auVar108._8_4_ = uVar7;
            auVar108._12_4_ = uVar7;
            auVar108._16_4_ = uVar7;
            auVar108._20_4_ = uVar7;
            auVar108._24_4_ = uVar7;
            auVar108._28_4_ = uVar7;
            bVar89 = bVar89 | bVar94 & bVar84;
            auVar25 = vcmpps_avx(_local_940,auVar108,2);
            local_480 = vandps_avx(auVar25,local_480);
          }
          auVar114._0_4_ = auVar202._0_4_ + fVar280;
          auVar114._4_4_ = auVar202._4_4_ + fVar308;
          auVar114._8_4_ = auVar202._8_4_ + fVar331;
          auVar114._12_4_ = auVar202._12_4_ + fVar281;
          auVar114._16_4_ = auVar202._16_4_ + fVar280;
          auVar114._20_4_ = auVar202._20_4_ + fVar308;
          auVar114._24_4_ = auVar202._24_4_ + fVar331;
          auVar114._28_4_ = auVar202._28_4_ + fVar281;
          auVar167 = vshufps_avx(auVar108._0_16_,auVar108._0_16_,0);
          auVar138._16_16_ = auVar167;
          auVar138._0_16_ = auVar167;
          auVar25 = vcmpps_avx(auVar114,auVar138,2);
          auVar106 = vandps_avx(auVar25,auVar106);
          auVar115._8_4_ = 3;
          auVar115._0_8_ = 0x300000003;
          auVar115._12_4_ = 3;
          auVar115._16_4_ = 3;
          auVar115._20_4_ = 3;
          auVar115._24_4_ = 3;
          auVar115._28_4_ = 3;
          auVar139._8_4_ = 2;
          auVar139._0_8_ = 0x200000002;
          auVar139._12_4_ = 2;
          auVar139._16_4_ = 2;
          auVar139._20_4_ = 2;
          auVar139._24_4_ = 2;
          auVar139._28_4_ = 2;
          auVar25 = vblendvps_avx(auVar139,auVar115,local_820);
          auVar167 = vpcmpgtd_avx(auVar25._16_16_,local_860);
          auVar211 = vpshufd_avx(local_840._0_16_,0);
          auVar211 = vpcmpgtd_avx(auVar25._0_16_,auVar211);
          auVar140._16_16_ = auVar167;
          auVar140._0_16_ = auVar211;
          _local_940 = vblendps_avx(ZEXT1632(auVar211),auVar140,0xf0);
          local_4a0 = vandnps_avx(_local_940,auVar106);
          local_8e0 = _local_420;
          local_be0._4_4_ = fVar308 + (float)local_420._4_4_;
          local_be0._0_4_ = fVar280 + (float)local_420._0_4_;
          fStack_bd8 = fVar331 + fStack_418;
          fStack_bd4 = fVar281 + fStack_414;
          fStack_bd0 = fVar280 + fStack_410;
          fStack_bcc = fVar308 + fStack_40c;
          fStack_bc8 = fVar331 + fStack_408;
          fStack_bc4 = fVar281 + fStack_404;
          while( true ) {
            if ((((((((local_4a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_4a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_4a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_4a0 >> 0x7f,0) == '\0') &&
                  (local_4a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_4a0 >> 0xbf,0) == '\0') &&
                (local_4a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_4a0[0x1f]) break;
            auVar141._8_4_ = 0x7f800000;
            auVar141._0_8_ = 0x7f8000007f800000;
            auVar141._12_4_ = 0x7f800000;
            auVar141._16_4_ = 0x7f800000;
            auVar141._20_4_ = 0x7f800000;
            auVar141._24_4_ = 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar25 = vblendvps_avx(auVar141,local_8e0,local_4a0);
            auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
            auVar26 = vminps_avx(auVar25,auVar26);
            auVar22 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar22 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar26 = vcmpps_avx(auVar25,auVar26,0);
            auVar22 = local_4a0 & auVar26;
            auVar25 = local_4a0;
            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0x7f,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0xbf,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar22[0x1f] < '\0') {
              auVar25 = vandps_avx(auVar26,local_4a0);
            }
            uVar88 = vmovmskps_avx(auVar25);
            uVar90 = 0;
            if (uVar88 != 0) {
              for (; (uVar88 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
              }
            }
            uVar86 = (ulong)uVar90;
            *(undefined4 *)(local_4a0 + uVar86 * 4) = 0;
            fVar298 = local_1c0[uVar86];
            uVar90 = *(uint *)(local_400 + uVar86 * 4);
            fVar326 = auVar19._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              auVar297 = ZEXT1664(auVar297._0_16_);
              fVar326 = sqrtf((float)local_9c0._0_4_);
              uVar86 = extraout_RAX_03;
            }
            auVar211 = vminps_avx(auVar15,auVar21);
            auVar167 = vmaxps_avx(auVar15,auVar21);
            auVar161 = vminps_avx(auVar20,_local_af0);
            auVar100 = vminps_avx(auVar211,auVar161);
            auVar211 = vmaxps_avx(auVar20,_local_af0);
            auVar161 = vmaxps_avx(auVar167,auVar211);
            auVar197._8_4_ = 0x7fffffff;
            auVar197._0_8_ = 0x7fffffff7fffffff;
            auVar197._12_4_ = 0x7fffffff;
            auVar167 = vandps_avx(auVar100,auVar197);
            auVar211 = vandps_avx(auVar161,auVar197);
            auVar167 = vmaxps_avx(auVar167,auVar211);
            auVar211 = vmovshdup_avx(auVar167);
            auVar211 = vmaxss_avx(auVar211,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar211);
            local_9a0 = auVar167._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar326 * 1.9073486e-06;
            local_920._0_16_ = vshufps_avx(auVar161,auVar161,0xff);
            auVar167 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar298),0x10);
            auVar349 = ZEXT1664(auVar167);
            uVar93 = 0;
            while( true ) {
              auVar167 = auVar349._0_16_;
              bVar84 = (byte)uVar86;
              if (uVar93 == 5) break;
              auVar211 = vshufps_avx(auVar167,auVar167,0);
              auVar103._0_4_ = auVar211._0_4_ * (float)local_9b0._0_4_ + 0.0;
              auVar103._4_4_ = auVar211._4_4_ * (float)local_9b0._4_4_ + 0.0;
              auVar103._8_4_ = auVar211._8_4_ * fStack_9a8 + 0.0;
              auVar103._12_4_ = auVar211._12_4_ * fStack_9a4 + 0.0;
              auVar211 = vmovshdup_avx(auVar167);
              fVar314 = auVar211._0_4_;
              fVar333 = 1.0 - fVar314;
              fVar326 = fVar314 * 3.0;
              fVar298 = fVar326 + -5.0;
              fVar311 = fVar333 * fVar333;
              auVar211 = ZEXT416((uint)(fVar314 * fVar314 * -fVar333 * 0.5));
              auVar211 = vshufps_avx(auVar211,auVar211,0);
              auVar161 = ZEXT416((uint)((fVar311 * (fVar333 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar100 = ZEXT416((uint)((fVar314 * fVar314 * fVar298 + 2.0) * 0.5));
              auVar100 = vshufps_avx(auVar100,auVar100,0);
              auVar121 = ZEXT416((uint)(fVar333 * fVar333 * -fVar314 * 0.5));
              auVar121 = vshufps_avx(auVar121,auVar121,0);
              auVar164._0_4_ =
                   auVar121._0_4_ * local_cf0 +
                   auVar100._0_4_ * local_c60 +
                   auVar161._0_4_ * local_c50 + auVar211._0_4_ * (float)local_af0._0_4_;
              auVar164._4_4_ =
                   auVar121._4_4_ * fStack_cec +
                   auVar100._4_4_ * fStack_c5c +
                   auVar161._4_4_ * fStack_c4c + auVar211._4_4_ * (float)local_af0._4_4_;
              auVar164._8_4_ =
                   auVar121._8_4_ * fStack_ce8 +
                   auVar100._8_4_ * fStack_c58 +
                   auVar161._8_4_ * fStack_c48 + auVar211._8_4_ * fStack_ae8;
              auVar164._12_4_ =
                   auVar121._12_4_ * fStack_ce4 +
                   auVar100._12_4_ * fStack_c54 +
                   auVar161._12_4_ * fStack_c44 + auVar211._12_4_ * fStack_ae4;
              _local_a60 = auVar164;
              auVar211 = vsubps_avx(auVar103,auVar164);
              _local_a40 = auVar211;
              auVar211 = vdpps_avx(auVar211,auVar211,0x7f);
              fVar283 = auVar211._0_4_;
              if (fVar283 < 0.0) {
                local_9e0._0_4_ = fVar314 * 9.0;
                local_a00._0_4_ = fVar298;
                local_a20._0_4_ = fVar311;
                local_900._0_4_ = fVar333 * -2.0;
                fVar335 = sqrtf(fVar283);
                uVar86 = extraout_RAX_04;
                fVar298 = (float)local_a00._0_4_;
                fVar206 = (float)local_9e0._0_4_;
                fVar152 = (float)local_900._0_4_;
                fVar311 = (float)local_a20._0_4_;
              }
              else {
                auVar161 = vsqrtss_avx(auVar211,auVar211);
                fVar335 = auVar161._0_4_;
                fVar206 = fVar314 * 9.0;
                fVar152 = fVar333 * -2.0;
              }
              auVar161 = ZEXT416((uint)((fVar314 * fVar314 + fVar314 * fVar152) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar100 = ZEXT416((uint)(((fVar333 + fVar333) * (fVar326 + 2.0) +
                                        fVar333 * fVar333 * -3.0) * 0.5));
              auVar100 = vshufps_avx(auVar100,auVar100,0);
              auVar121 = ZEXT416((uint)((fVar298 * (fVar314 + fVar314) + fVar314 * fVar326) * 0.5));
              auVar121 = vshufps_avx(auVar121,auVar121,0);
              auVar95 = ZEXT416((uint)((fVar314 * (fVar333 + fVar333) - fVar311) * 0.5));
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              auVar330._0_4_ =
                   local_cf0 * auVar95._0_4_ +
                   local_c60 * auVar121._0_4_ +
                   (float)local_af0._0_4_ * auVar161._0_4_ + local_c50 * auVar100._0_4_;
              auVar330._4_4_ =
                   fStack_cec * auVar95._4_4_ +
                   fStack_c5c * auVar121._4_4_ +
                   (float)local_af0._4_4_ * auVar161._4_4_ + fStack_c4c * auVar100._4_4_;
              auVar330._8_4_ =
                   fStack_ce8 * auVar95._8_4_ +
                   fStack_c58 * auVar121._8_4_ +
                   fStack_ae8 * auVar161._8_4_ + fStack_c48 * auVar100._8_4_;
              auVar330._12_4_ =
                   fStack_ce4 * auVar95._12_4_ +
                   fStack_c54 * auVar121._12_4_ +
                   fStack_ae4 * auVar161._12_4_ + fStack_c44 * auVar100._12_4_;
              auVar95 = vpermilps_avx(ZEXT416((uint)(fVar326 + -1.0)),0);
              auVar96 = vpermilps_avx(ZEXT416((uint)(fVar314 * -9.0 + 4.0)),0);
              auVar161 = vshufps_avx(ZEXT416((uint)(fVar206 + -5.0)),ZEXT416((uint)(fVar206 + -5.0))
                                     ,0);
              auVar100 = ZEXT416((uint)(fVar314 * -3.0 + 2.0));
              auVar121 = vshufps_avx(auVar100,auVar100,0);
              auVar100 = vdpps_avx(auVar330,auVar330,0x7f);
              auVar126._0_4_ =
                   local_cf0 * auVar121._0_4_ +
                   local_c60 * auVar161._0_4_ +
                   local_c50 * auVar96._0_4_ + (float)local_af0._0_4_ * auVar95._0_4_;
              auVar126._4_4_ =
                   fStack_cec * auVar121._4_4_ +
                   fStack_c5c * auVar161._4_4_ +
                   fStack_c4c * auVar96._4_4_ + (float)local_af0._4_4_ * auVar95._4_4_;
              auVar126._8_4_ =
                   fStack_ce8 * auVar121._8_4_ +
                   fStack_c58 * auVar161._8_4_ +
                   fStack_c48 * auVar96._8_4_ + fStack_ae8 * auVar95._8_4_;
              auVar126._12_4_ =
                   fStack_ce4 * auVar121._12_4_ +
                   fStack_c54 * auVar161._12_4_ +
                   fStack_c44 * auVar96._12_4_ + fStack_ae4 * auVar95._12_4_;
              auVar161 = vblendps_avx(auVar100,_DAT_01f45a50,0xe);
              auVar121 = vrsqrtss_avx(auVar161,auVar161);
              fVar326 = auVar121._0_4_;
              fVar298 = auVar100._0_4_;
              auVar121 = vdpps_avx(auVar330,auVar126,0x7f);
              auVar95 = vshufps_avx(auVar100,auVar100,0);
              auVar127._0_4_ = auVar126._0_4_ * auVar95._0_4_;
              auVar127._4_4_ = auVar126._4_4_ * auVar95._4_4_;
              auVar127._8_4_ = auVar126._8_4_ * auVar95._8_4_;
              auVar127._12_4_ = auVar126._12_4_ * auVar95._12_4_;
              auVar121 = vshufps_avx(auVar121,auVar121,0);
              auVar214._0_4_ = auVar330._0_4_ * auVar121._0_4_;
              auVar214._4_4_ = auVar330._4_4_ * auVar121._4_4_;
              auVar214._8_4_ = auVar330._8_4_ * auVar121._8_4_;
              auVar214._12_4_ = auVar330._12_4_ * auVar121._12_4_;
              auVar96 = vsubps_avx(auVar127,auVar214);
              auVar121 = vrcpss_avx(auVar161,auVar161);
              auVar161 = vmaxss_avx(ZEXT416((uint)local_9a0),
                                    ZEXT416((uint)(auVar349._0_4_ * (float)local_980._0_4_)));
              auVar121 = ZEXT416((uint)(auVar121._0_4_ * (2.0 - fVar298 * auVar121._0_4_)));
              auVar121 = vshufps_avx(auVar121,auVar121,0);
              uVar76 = CONCAT44(auVar330._4_4_,auVar330._0_4_);
              auVar240._0_8_ = uVar76 ^ 0x8000000080000000;
              auVar240._8_4_ = -auVar330._8_4_;
              auVar240._12_4_ = -auVar330._12_4_;
              auVar95 = ZEXT416((uint)(fVar326 * 1.5 + fVar298 * -0.5 * fVar326 * fVar326 * fVar326)
                               );
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              auVar198._0_4_ = auVar95._0_4_ * auVar96._0_4_ * auVar121._0_4_;
              auVar198._4_4_ = auVar95._4_4_ * auVar96._4_4_ * auVar121._4_4_;
              auVar198._8_4_ = auVar95._8_4_ * auVar96._8_4_ * auVar121._8_4_;
              auVar198._12_4_ = auVar95._12_4_ * auVar96._12_4_ * auVar121._12_4_;
              auVar261._0_4_ = auVar330._0_4_ * auVar95._0_4_;
              auVar261._4_4_ = auVar330._4_4_ * auVar95._4_4_;
              auVar261._8_4_ = auVar330._8_4_ * auVar95._8_4_;
              auVar261._12_4_ = auVar330._12_4_ * auVar95._12_4_;
              if (fVar298 < 0.0) {
                fVar298 = sqrtf(fVar298);
                uVar86 = extraout_RAX_05;
              }
              else {
                auVar100 = vsqrtss_avx(auVar100,auVar100);
                fVar298 = auVar100._0_4_;
              }
              auVar100 = vdpps_avx(_local_a40,auVar261,0x7f);
              fVar298 = (local_9a0 / fVar298) * (fVar335 + 1.0) +
                        fVar335 * local_9a0 + auVar161._0_4_;
              auVar121 = vdpps_avx(auVar240,auVar261,0x7f);
              auVar95 = vdpps_avx(_local_a40,auVar198,0x7f);
              auVar96 = vdpps_avx(_local_9b0,auVar261,0x7f);
              auVar97 = vdpps_avx(_local_a40,auVar240,0x7f);
              fVar326 = auVar121._0_4_ + auVar95._0_4_;
              fVar311 = auVar100._0_4_;
              auVar104._0_4_ = fVar311 * fVar311;
              auVar104._4_4_ = auVar100._4_4_ * auVar100._4_4_;
              auVar104._8_4_ = auVar100._8_4_ * auVar100._8_4_;
              auVar104._12_4_ = auVar100._12_4_ * auVar100._12_4_;
              auVar95 = vsubps_avx(auVar211,auVar104);
              auVar121 = vdpps_avx(_local_a40,_local_9b0,0x7f);
              fVar333 = auVar97._0_4_ - fVar311 * fVar326;
              fVar314 = auVar121._0_4_ - fVar311 * auVar96._0_4_;
              auVar121 = vrsqrtss_avx(auVar95,auVar95);
              fVar335 = auVar95._0_4_;
              fVar311 = auVar121._0_4_;
              fVar311 = fVar311 * 1.5 + fVar335 * -0.5 * fVar311 * fVar311 * fVar311;
              if (fVar335 < 0.0) {
                local_9e0._0_4_ = fVar333;
                local_a00._0_4_ = fVar314;
                local_a20._0_4_ = fVar311;
                fVar335 = sqrtf(fVar335);
                uVar86 = extraout_RAX_06;
                fVar311 = (float)local_a20._0_4_;
                fVar333 = (float)local_9e0._0_4_;
                fVar314 = (float)local_a00._0_4_;
              }
              else {
                auVar121 = vsqrtss_avx(auVar95,auVar95);
                fVar335 = auVar121._0_4_;
              }
              auVar297 = ZEXT1664(auVar211);
              auVar97 = vpermilps_avx(_local_a60,0xff);
              auVar156 = vshufps_avx(auVar330,auVar330,0xff);
              fVar333 = fVar333 * fVar311 - auVar156._0_4_;
              auVar215._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
              auVar215._8_4_ = auVar96._8_4_ ^ 0x80000000;
              auVar215._12_4_ = auVar96._12_4_ ^ 0x80000000;
              auVar241._0_4_ = -fVar333;
              auVar241._4_4_ = 0x80000000;
              auVar241._8_4_ = 0x80000000;
              auVar241._12_4_ = 0x80000000;
              auVar121 = vinsertps_avx(auVar241,ZEXT416((uint)(fVar314 * fVar311)),0x1c);
              auVar96 = vmovsldup_avx(ZEXT416((uint)(fVar326 * fVar314 * fVar311 -
                                                    auVar96._0_4_ * fVar333)));
              auVar121 = vdivps_avx(auVar121,auVar96);
              auVar95 = vinsertps_avx(ZEXT416((uint)fVar326),auVar215,0x10);
              auVar95 = vdivps_avx(auVar95,auVar96);
              auVar96 = vmovsldup_avx(auVar100);
              auVar102 = ZEXT416((uint)(fVar335 - auVar97._0_4_));
              auVar97 = vmovsldup_avx(auVar102);
              auVar165._0_4_ = auVar96._0_4_ * auVar121._0_4_ + auVar97._0_4_ * auVar95._0_4_;
              auVar165._4_4_ = auVar96._4_4_ * auVar121._4_4_ + auVar97._4_4_ * auVar95._4_4_;
              auVar165._8_4_ = auVar96._8_4_ * auVar121._8_4_ + auVar97._8_4_ * auVar95._8_4_;
              auVar165._12_4_ = auVar96._12_4_ * auVar121._12_4_ + auVar97._12_4_ * auVar95._12_4_;
              auVar121 = vsubps_avx(auVar167,auVar165);
              auVar349 = ZEXT1664(auVar121);
              auVar166._8_4_ = 0x7fffffff;
              auVar166._0_8_ = 0x7fffffff7fffffff;
              auVar166._12_4_ = 0x7fffffff;
              auVar167 = vandps_avx(auVar100,auVar166);
              if (auVar167._0_4_ < fVar298) {
                auVar199._8_4_ = 0x7fffffff;
                auVar199._0_8_ = 0x7fffffff7fffffff;
                auVar199._12_4_ = 0x7fffffff;
                auVar167 = vandps_avx(auVar102,auVar199);
                if (auVar167._0_4_ <
                    (float)local_920._0_4_ * 1.9073486e-06 + fVar298 + auVar161._0_4_) {
                  bVar94 = uVar93 < 5;
                  fVar298 = auVar121._0_4_ + (float)local_960._0_4_;
                  if (fVar298 < fVar271) {
                    bVar84 = 0;
                    goto LAB_009333e3;
                  }
                  fVar326 = *(float *)(ray + k * 4 + 0x100);
                  auVar307 = ZEXT3264(local_ae0);
                  if (fVar298 <= fVar326) {
                    auVar167 = vmovshdup_avx(auVar121);
                    bVar84 = 0;
                    if ((auVar167._0_4_ < 0.0) || (1.0 < auVar167._0_4_)) goto LAB_009333f5;
                    auVar167 = vrsqrtss_avx(auVar211,auVar211);
                    fVar311 = auVar167._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_a98].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar84 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_009333f5;
                      auVar167 = ZEXT416((uint)(fVar311 * 1.5 +
                                               fVar283 * -0.5 * fVar311 * fVar311 * fVar311));
                      auVar167 = vshufps_avx(auVar167,auVar167,0);
                      auVar168._0_4_ = auVar167._0_4_ * (float)local_a40._0_4_;
                      auVar168._4_4_ = auVar167._4_4_ * (float)local_a40._4_4_;
                      auVar168._8_4_ = auVar167._8_4_ * fStack_a38;
                      auVar168._12_4_ = auVar167._12_4_ * fStack_a34;
                      auVar128._0_4_ = auVar330._0_4_ + auVar156._0_4_ * auVar168._0_4_;
                      auVar128._4_4_ = auVar330._4_4_ + auVar156._4_4_ * auVar168._4_4_;
                      auVar128._8_4_ = auVar330._8_4_ + auVar156._8_4_ * auVar168._8_4_;
                      auVar128._12_4_ = auVar330._12_4_ + auVar156._12_4_ * auVar168._12_4_;
                      auVar167 = vshufps_avx(auVar168,auVar168,0xc9);
                      auVar161 = vshufps_avx(auVar330,auVar330,0xc9);
                      auVar169._0_4_ = auVar161._0_4_ * auVar168._0_4_;
                      auVar169._4_4_ = auVar161._4_4_ * auVar168._4_4_;
                      auVar169._8_4_ = auVar161._8_4_ * auVar168._8_4_;
                      auVar169._12_4_ = auVar161._12_4_ * auVar168._12_4_;
                      auVar200._0_4_ = auVar330._0_4_ * auVar167._0_4_;
                      auVar200._4_4_ = auVar330._4_4_ * auVar167._4_4_;
                      auVar200._8_4_ = auVar330._8_4_ * auVar167._8_4_;
                      auVar200._12_4_ = auVar330._12_4_ * auVar167._12_4_;
                      auVar100 = vsubps_avx(auVar200,auVar169);
                      auVar167 = vshufps_avx(auVar100,auVar100,0xc9);
                      auVar161 = vshufps_avx(auVar128,auVar128,0xc9);
                      auVar201._0_4_ = auVar161._0_4_ * auVar167._0_4_;
                      auVar201._4_4_ = auVar161._4_4_ * auVar167._4_4_;
                      auVar201._8_4_ = auVar161._8_4_ * auVar167._8_4_;
                      auVar201._12_4_ = auVar161._12_4_ * auVar167._12_4_;
                      auVar167 = vshufps_avx(auVar100,auVar100,0xd2);
                      auVar129._0_4_ = auVar128._0_4_ * auVar167._0_4_;
                      auVar129._4_4_ = auVar128._4_4_ * auVar167._4_4_;
                      auVar129._8_4_ = auVar128._8_4_ * auVar167._8_4_;
                      auVar129._12_4_ = auVar128._12_4_ * auVar167._12_4_;
                      auVar167 = vsubps_avx(auVar201,auVar129);
                      pRVar13 = context->user;
                      local_760 = vshufps_avx(auVar121,auVar121,0x55);
                      auStack_7b0 = vshufps_avx(auVar167,auVar167,0x55);
                      local_7a0 = vshufps_avx(auVar167,auVar167,0xaa);
                      local_780 = vshufps_avx(auVar167,auVar167,0);
                      local_7c0 = (RTCHitN  [16])auStack_7b0;
                      local_740 = ZEXT832(0) << 0x20;
                      local_720 = local_660._0_8_;
                      uStack_718 = local_660._8_8_;
                      uStack_710 = local_660._16_8_;
                      uStack_708 = local_660._24_8_;
                      local_700 = local_640;
                      auVar25 = vcmpps_avx(local_640,local_640,0xf);
                      local_aa0[1] = auVar25;
                      *local_aa0 = auVar25;
                      local_6e0 = pRVar13->instID[0];
                      local_6c0 = pRVar13->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar298;
                      local_b20 = *local_aa8;
                      local_b10 = *local_ab0;
                      local_a90.valid = (int *)local_b20;
                      local_a90.geometryUserPtr = pGVar9->userPtr;
                      local_a90.context = context->user;
                      local_a90.hit = local_7c0;
                      local_a90.N = 8;
                      local_a90.ray = (RTCRayN *)ray;
                      local_790 = local_7a0;
                      local_770 = local_780;
                      local_750 = local_760;
                      uStack_6dc = local_6e0;
                      uStack_6d8 = local_6e0;
                      uStack_6d4 = local_6e0;
                      uStack_6d0 = local_6e0;
                      uStack_6cc = local_6e0;
                      uStack_6c8 = local_6e0;
                      uStack_6c4 = local_6e0;
                      uStack_6bc = local_6c0;
                      uStack_6b8 = local_6c0;
                      uStack_6b4 = local_6c0;
                      uStack_6b0 = local_6c0;
                      uStack_6ac = local_6c0;
                      uStack_6a8 = local_6c0;
                      uStack_6a4 = local_6c0;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar297 = ZEXT1664(auVar211);
                        auVar349 = ZEXT1664(auVar121);
                        (*pGVar9->occlusionFilterN)(&local_a90);
                      }
                      auVar167 = vpcmpeqd_avx(local_b20,ZEXT816(0) << 0x40);
                      auVar211 = vpcmpeqd_avx(local_b10,ZEXT816(0) << 0x40);
                      auVar174._16_16_ = auVar211;
                      auVar174._0_16_ = auVar167;
                      auVar25 = _DAT_01f7b020 & ~auVar174;
                      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar25 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar25 >> 0x7f,0) == '\0') &&
                            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar25 >> 0xbf,0) == '\0') &&
                          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar25[0x1f]) {
                        auVar307 = ZEXT3264(local_ae0);
                      }
                      else {
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar297 = ZEXT1664(auVar297._0_16_);
                          auVar349 = ZEXT1664(auVar349._0_16_);
                          (*p_Var14)(&local_a90);
                        }
                        auVar167 = vpcmpeqd_avx(local_b20,ZEXT816(0) << 0x40);
                        auVar211 = vpcmpeqd_avx(local_b10,ZEXT816(0) << 0x40);
                        auVar116._16_16_ = auVar211;
                        auVar116._0_16_ = auVar167;
                        auVar142._8_4_ = 0xff800000;
                        auVar142._0_8_ = 0xff800000ff800000;
                        auVar142._12_4_ = 0xff800000;
                        auVar142._16_4_ = 0xff800000;
                        auVar142._20_4_ = 0xff800000;
                        auVar142._24_4_ = 0xff800000;
                        auVar142._28_4_ = 0xff800000;
                        auVar25 = vblendvps_avx(auVar142,*(undefined1 (*) [32])
                                                          (local_a90.ray + 0x100),auVar116);
                        *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar25;
                        auVar25 = _DAT_01f7b020 & ~auVar116;
                        auVar307 = ZEXT3264(local_ae0);
                        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar25 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar25 >> 0x7f,0) != '\0') ||
                              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar25 >> 0xbf,0) != '\0') ||
                            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar25[0x1f] < '\0') {
                          bVar84 = 1;
                          goto LAB_009333f5;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar326;
                    }
                  }
                  bVar84 = 0;
                  goto LAB_009333f5;
                }
              }
              uVar93 = uVar93 + 1;
            }
            bVar94 = false;
LAB_009333e3:
            auVar307 = ZEXT3264(local_ae0);
LAB_009333f5:
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar108._4_4_ = uVar7;
            auVar108._0_4_ = uVar7;
            auVar108._8_4_ = uVar7;
            auVar108._12_4_ = uVar7;
            auVar108._16_4_ = uVar7;
            auVar108._20_4_ = uVar7;
            auVar108._24_4_ = uVar7;
            auVar108._28_4_ = uVar7;
            bVar89 = bVar89 | bVar94 & bVar84;
            auVar25 = vcmpps_avx(_local_be0,auVar108,2);
            local_4a0 = vandps_avx(auVar25,local_4a0);
          }
          auVar25 = vandps_avx(auVar307._0_32_,local_800);
          auVar106 = vandps_avx(_local_940,auVar106);
          auVar175._0_4_ = fVar280 + local_460._0_4_;
          auVar175._4_4_ = fVar308 + local_460._4_4_;
          auVar175._8_4_ = fVar331 + local_460._8_4_;
          auVar175._12_4_ = fVar281 + local_460._12_4_;
          auVar175._16_4_ = fVar280 + local_460._16_4_;
          auVar175._20_4_ = fVar308 + local_460._20_4_;
          auVar175._24_4_ = fVar331 + local_460._24_4_;
          auVar175._28_4_ = fVar281 + local_460._28_4_;
          auVar167 = vshufps_avx(auVar108._0_16_,auVar108._0_16_,0);
          auVar220._16_16_ = auVar167;
          auVar220._0_16_ = auVar167;
          auVar26 = vcmpps_avx(auVar175,auVar220,2);
          auVar25 = vandps_avx(auVar26,auVar25);
          auVar249._0_4_ = fVar280 + local_420._0_4_;
          auVar249._4_4_ = fVar308 + local_420._4_4_;
          auVar249._8_4_ = fVar331 + local_420._8_4_;
          auVar249._12_4_ = fVar281 + local_420._12_4_;
          auVar249._16_4_ = fVar280 + local_420._16_4_;
          auVar249._20_4_ = fVar308 + local_420._20_4_;
          auVar249._24_4_ = fVar331 + local_420._24_4_;
          auVar249._28_4_ = fVar281 + local_420._28_4_;
          auVar26 = vcmpps_avx(auVar249,auVar220,2);
          auVar222 = ZEXT3264(auVar26);
          auVar106 = vandps_avx(auVar26,auVar106);
          auVar106 = vorps_avx(auVar25,auVar106);
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar85 * 0x60) = auVar106;
            auVar106 = vblendvps_avx(_local_420,_local_460,auVar25);
            *(undefined1 (*) [32])(auStack_160 + uVar85 * 0x60) = auVar106;
            uVar86 = vmovlps_avx(local_7d0);
            (&uStack_140)[uVar85 * 0xc] = uVar86;
            auStack_138[uVar85 * 0x18] = local_d24 + 1;
            uVar85 = (ulong)((int)uVar85 + 1);
          }
          auVar307 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
        }
      }
    }
    while( true ) {
      uVar90 = (uint)uVar85;
      if (uVar90 == 0) {
        if (bVar89 != 0) goto LAB_00933ae3;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar105._4_4_ = uVar7;
        auVar105._0_4_ = uVar7;
        auVar105._8_4_ = uVar7;
        auVar105._12_4_ = uVar7;
        auVar120 = vcmpps_avx(local_7e0,auVar105,2);
        uVar90 = vmovmskps_avx(auVar120);
        uVar90 = (uint)local_948 - 1 & (uint)local_948 & uVar90;
        goto LAB_00930c89;
      }
      uVar85 = (ulong)(uVar90 - 1);
      lVar91 = uVar85 * 0x60;
      auVar106 = *(undefined1 (*) [32])(auStack_160 + lVar91);
      auVar117._0_4_ = fVar280 + auVar106._0_4_;
      auVar117._4_4_ = fVar308 + auVar106._4_4_;
      auVar117._8_4_ = fVar331 + auVar106._8_4_;
      auVar117._12_4_ = fVar281 + auVar106._12_4_;
      auVar117._16_4_ = fVar280 + auVar106._16_4_;
      auVar117._20_4_ = fVar308 + auVar106._20_4_;
      auVar117._24_4_ = fVar331 + auVar106._24_4_;
      auVar117._28_4_ = fVar281 + auVar106._28_4_;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar204._4_4_ = uVar7;
      auVar204._0_4_ = uVar7;
      auVar204._8_4_ = uVar7;
      auVar204._12_4_ = uVar7;
      auVar204._16_4_ = uVar7;
      auVar204._20_4_ = uVar7;
      auVar204._24_4_ = uVar7;
      auVar204._28_4_ = uVar7;
      auVar25 = vcmpps_avx(auVar117,auVar204,2);
      _local_7c0 = vandps_avx(auVar25,*(undefined1 (*) [32])(auStack_180 + lVar91));
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar91) & auVar25;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') break;
      uVar85 = (ulong)(uVar90 - 1);
    }
    auVar176._8_4_ = 0x7f800000;
    auVar176._0_8_ = 0x7f8000007f800000;
    auVar176._12_4_ = 0x7f800000;
    auVar176._16_4_ = 0x7f800000;
    auVar176._20_4_ = 0x7f800000;
    auVar176._24_4_ = 0x7f800000;
    auVar176._28_4_ = 0x7f800000;
    auVar106 = vblendvps_avx(auVar176,auVar106,_local_7c0);
    auVar25 = vshufps_avx(auVar106,auVar106,0xb1);
    auVar25 = vminps_avx(auVar106,auVar25);
    auVar26 = vshufpd_avx(auVar25,auVar25,5);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar26 = vperm2f128_avx(auVar25,auVar25,1);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar25 = vcmpps_avx(auVar106,auVar25,0);
    auVar26 = _local_7c0 & auVar25;
    auVar106 = _local_7c0;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar106 = vandps_avx(auVar25,_local_7c0);
    }
    auVar130._8_8_ = 0;
    auVar130._0_8_ = (&uStack_140)[uVar85 * 0xc];
    local_d24 = auStack_138[uVar85 * 0x18];
    uVar87 = vmovmskps_avx(auVar106);
    uVar88 = 0;
    if (uVar87 != 0) {
      for (; (uVar87 >> uVar88 & 1) == 0; uVar88 = uVar88 + 1) {
      }
    }
    *(undefined4 *)(local_7c0 + (ulong)uVar88 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar91) = _local_7c0;
    uVar87 = uVar90 - 1;
    if ((((((((_local_7c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7c0 >> 0x7f,0) != '\0') ||
          (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7c0 >> 0xbf,0) != '\0') ||
        (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7c0[0x1f] < '\0') {
      uVar87 = uVar90;
    }
    auVar167 = vshufps_avx(auVar130,auVar130,0);
    auVar211 = vshufps_avx(auVar130,auVar130,0x55);
    auVar211 = vsubps_avx(auVar211,auVar167);
    local_460._4_4_ = auVar167._4_4_ + auVar211._4_4_ * 0.14285715;
    local_460._0_4_ = auVar167._0_4_ + auVar211._0_4_ * 0.0;
    fStack_458 = auVar167._8_4_ + auVar211._8_4_ * 0.2857143;
    fStack_454 = auVar167._12_4_ + auVar211._12_4_ * 0.42857146;
    fStack_450 = auVar167._0_4_ + auVar211._0_4_ * 0.5714286;
    fStack_44c = auVar167._4_4_ + auVar211._4_4_ * 0.71428573;
    fStack_448 = auVar167._8_4_ + auVar211._8_4_ * 0.8571429;
    fStack_444 = auVar167._12_4_ + auVar211._12_4_;
    local_7d0._8_8_ = 0;
    local_7d0._0_8_ = *(ulong *)(local_460 + (ulong)uVar88 * 4);
    uVar85 = (ulong)uVar87;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }